

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  Geometry *pGVar11;
  long lVar12;
  __int_type_conflict _Var13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  bool bVar63;
  byte bVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar69;
  uint uVar70;
  ulong uVar72;
  undefined4 uVar73;
  undefined8 unaff_R13;
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar75 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar106 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float t1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar205 [32];
  float fVar210;
  float fVar214;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar215;
  float fVar227;
  float fVar228;
  undefined1 auVar216 [16];
  float fVar229;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [32];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar247;
  float fVar248;
  vfloat4 b0;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar249;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar286;
  float fVar287;
  vfloat4 a0_1;
  float fVar288;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float pp;
  float fVar289;
  float fVar299;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar297;
  float fVar298;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar300;
  float fVar305;
  undefined1 auVar301 [16];
  float fVar303;
  float fVar304;
  float fVar306;
  float fVar307;
  float fVar308;
  float in_register_0000151c;
  undefined1 auVar302 [32];
  float fVar309;
  float fVar310;
  float fVar316;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar314;
  float fVar315;
  undefined1 auVar313 [32];
  float fVar317;
  float fVar318;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float in_register_0000159c;
  undefined1 auVar326 [64];
  float fVar335;
  vfloat4 a0;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float in_register_000015dc;
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  uint auStack_4d0 [4];
  RTCFilterFunctionNArguments local_4c0;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  float afStack_360 [8];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar71;
  undefined1 auVar226 [32];
  undefined1 auVar325 [32];
  
  PVar10 = prim[1];
  uVar68 = (ulong)(byte)PVar10;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar220 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar220 = vinsertps_avx(auVar220,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar234 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar79 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar101._0_4_ = fVar234 * auVar79._0_4_;
  auVar101._4_4_ = fVar234 * auVar79._4_4_;
  auVar101._8_4_ = fVar234 * auVar79._8_4_;
  auVar101._12_4_ = fVar234 * auVar79._12_4_;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 10)));
  auVar216._0_4_ = fVar234 * auVar220._0_4_;
  auVar216._4_4_ = fVar234 * auVar220._4_4_;
  auVar216._8_4_ = fVar234 * auVar220._8_4_;
  auVar216._12_4_ = fVar234 * auVar220._12_4_;
  auVar90._16_16_ = auVar155;
  auVar90._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 10)));
  auVar157._16_16_ = auVar220;
  auVar157._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar157);
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 10)));
  auVar169._16_16_ = auVar220;
  auVar169._0_16_ = auVar79;
  auVar16 = vcvtdq2ps_avx(auVar169);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 10)));
  auVar170._16_16_ = auVar220;
  auVar170._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xc + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xc + 10)));
  auVar17 = vcvtdq2ps_avx(auVar170);
  auVar205._16_16_ = auVar220;
  auVar205._0_16_ = auVar79;
  auVar18 = vcvtdq2ps_avx(auVar205);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xd + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xd + 10)));
  auVar242._16_16_ = auVar220;
  auVar242._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x12 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar242);
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x12 + 10)));
  auVar243._16_16_ = auVar220;
  auVar243._0_16_ = auVar79;
  auVar20 = vcvtdq2ps_avx(auVar243);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x13 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x13 + 10)));
  auVar272._16_16_ = auVar220;
  auVar272._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x14 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x14 + 10)));
  auVar21 = vcvtdq2ps_avx(auVar272);
  auVar283._16_16_ = auVar220;
  auVar283._0_16_ = auVar79;
  auVar22 = vcvtdq2ps_avx(auVar283);
  auVar79 = vshufps_avx(auVar216,auVar216,0);
  auVar220 = vshufps_avx(auVar216,auVar216,0x55);
  auVar155 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar234 = auVar155._0_4_;
  fVar192 = auVar155._4_4_;
  fVar247 = auVar155._8_4_;
  fVar209 = auVar155._12_4_;
  fVar248 = auVar220._0_4_;
  fVar214 = auVar220._4_4_;
  fVar249 = auVar220._8_4_;
  fVar210 = auVar220._12_4_;
  fVar250 = auVar79._0_4_;
  fVar211 = auVar79._4_4_;
  fVar251 = auVar79._8_4_;
  fVar212 = auVar79._12_4_;
  auVar302._0_4_ = fVar250 * auVar90._0_4_ + fVar248 * auVar15._0_4_ + fVar234 * auVar16._0_4_;
  auVar302._4_4_ = fVar211 * auVar90._4_4_ + fVar214 * auVar15._4_4_ + fVar192 * auVar16._4_4_;
  auVar302._8_4_ = fVar251 * auVar90._8_4_ + fVar249 * auVar15._8_4_ + fVar247 * auVar16._8_4_;
  auVar302._12_4_ = fVar212 * auVar90._12_4_ + fVar210 * auVar15._12_4_ + fVar209 * auVar16._12_4_;
  auVar302._16_4_ = fVar250 * auVar90._16_4_ + fVar248 * auVar15._16_4_ + fVar234 * auVar16._16_4_;
  auVar302._20_4_ = fVar211 * auVar90._20_4_ + fVar214 * auVar15._20_4_ + fVar192 * auVar16._20_4_;
  auVar302._24_4_ = fVar251 * auVar90._24_4_ + fVar249 * auVar15._24_4_ + fVar247 * auVar16._24_4_;
  auVar302._28_4_ = fVar210 + in_register_000015dc + in_register_0000151c;
  auVar294._0_4_ = fVar250 * auVar17._0_4_ + fVar248 * auVar18._0_4_ + auVar19._0_4_ * fVar234;
  auVar294._4_4_ = fVar211 * auVar17._4_4_ + fVar214 * auVar18._4_4_ + auVar19._4_4_ * fVar192;
  auVar294._8_4_ = fVar251 * auVar17._8_4_ + fVar249 * auVar18._8_4_ + auVar19._8_4_ * fVar247;
  auVar294._12_4_ = fVar212 * auVar17._12_4_ + fVar210 * auVar18._12_4_ + auVar19._12_4_ * fVar209;
  auVar294._16_4_ = fVar250 * auVar17._16_4_ + fVar248 * auVar18._16_4_ + auVar19._16_4_ * fVar234;
  auVar294._20_4_ = fVar211 * auVar17._20_4_ + fVar214 * auVar18._20_4_ + auVar19._20_4_ * fVar192;
  auVar294._24_4_ = fVar251 * auVar17._24_4_ + fVar249 * auVar18._24_4_ + auVar19._24_4_ * fVar247;
  auVar294._28_4_ = fVar210 + in_register_000015dc + in_register_0000159c;
  auVar225._0_4_ = fVar250 * auVar20._0_4_ + fVar248 * auVar21._0_4_ + auVar22._0_4_ * fVar234;
  auVar225._4_4_ = fVar211 * auVar20._4_4_ + fVar214 * auVar21._4_4_ + auVar22._4_4_ * fVar192;
  auVar225._8_4_ = fVar251 * auVar20._8_4_ + fVar249 * auVar21._8_4_ + auVar22._8_4_ * fVar247;
  auVar225._12_4_ = fVar212 * auVar20._12_4_ + fVar210 * auVar21._12_4_ + auVar22._12_4_ * fVar209;
  auVar225._16_4_ = fVar250 * auVar20._16_4_ + fVar248 * auVar21._16_4_ + auVar22._16_4_ * fVar234;
  auVar225._20_4_ = fVar211 * auVar20._20_4_ + fVar214 * auVar21._20_4_ + auVar22._20_4_ * fVar192;
  auVar225._24_4_ = fVar251 * auVar20._24_4_ + fVar249 * auVar21._24_4_ + auVar22._24_4_ * fVar247;
  auVar225._28_4_ = fVar212 + fVar210 + fVar209;
  auVar79 = vshufps_avx(auVar101,auVar101,0);
  auVar220 = vshufps_avx(auVar101,auVar101,0x55);
  auVar155 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar192 = auVar155._0_4_;
  fVar247 = auVar155._4_4_;
  fVar209 = auVar155._8_4_;
  fVar248 = auVar155._12_4_;
  fVar251 = auVar220._0_4_;
  fVar212 = auVar220._4_4_;
  fVar252 = auVar220._8_4_;
  fVar213 = auVar220._12_4_;
  fVar214 = auVar18._28_4_ + fVar248;
  fVar249 = auVar79._0_4_;
  fVar210 = auVar79._4_4_;
  fVar250 = auVar79._8_4_;
  fVar211 = auVar79._12_4_;
  fVar234 = auVar90._28_4_;
  auVar125._0_4_ = fVar249 * auVar90._0_4_ + fVar251 * auVar15._0_4_ + fVar192 * auVar16._0_4_;
  auVar125._4_4_ = fVar210 * auVar90._4_4_ + fVar212 * auVar15._4_4_ + fVar247 * auVar16._4_4_;
  auVar125._8_4_ = fVar250 * auVar90._8_4_ + fVar252 * auVar15._8_4_ + fVar209 * auVar16._8_4_;
  auVar125._12_4_ = fVar211 * auVar90._12_4_ + fVar213 * auVar15._12_4_ + fVar248 * auVar16._12_4_;
  auVar125._16_4_ = fVar249 * auVar90._16_4_ + fVar251 * auVar15._16_4_ + fVar192 * auVar16._16_4_;
  auVar125._20_4_ = fVar210 * auVar90._20_4_ + fVar212 * auVar15._20_4_ + fVar247 * auVar16._20_4_;
  auVar125._24_4_ = fVar250 * auVar90._24_4_ + fVar252 * auVar15._24_4_ + fVar209 * auVar16._24_4_;
  auVar125._28_4_ = fVar234 + auVar15._28_4_ + auVar16._28_4_;
  auVar158._0_4_ = fVar249 * auVar17._0_4_ + auVar19._0_4_ * fVar192 + fVar251 * auVar18._0_4_;
  auVar158._4_4_ = fVar210 * auVar17._4_4_ + auVar19._4_4_ * fVar247 + fVar212 * auVar18._4_4_;
  auVar158._8_4_ = fVar250 * auVar17._8_4_ + auVar19._8_4_ * fVar209 + fVar252 * auVar18._8_4_;
  auVar158._12_4_ = fVar211 * auVar17._12_4_ + auVar19._12_4_ * fVar248 + fVar213 * auVar18._12_4_;
  auVar158._16_4_ = fVar249 * auVar17._16_4_ + auVar19._16_4_ * fVar192 + fVar251 * auVar18._16_4_;
  auVar158._20_4_ = fVar210 * auVar17._20_4_ + auVar19._20_4_ * fVar247 + fVar212 * auVar18._20_4_;
  auVar158._24_4_ = fVar250 * auVar17._24_4_ + auVar19._24_4_ * fVar209 + fVar252 * auVar18._24_4_;
  auVar158._28_4_ = fVar234 + auVar19._28_4_ + auVar16._28_4_;
  auVar171._8_4_ = 0x7fffffff;
  auVar171._0_8_ = 0x7fffffff7fffffff;
  auVar171._12_4_ = 0x7fffffff;
  auVar171._16_4_ = 0x7fffffff;
  auVar171._20_4_ = 0x7fffffff;
  auVar171._24_4_ = 0x7fffffff;
  auVar171._28_4_ = 0x7fffffff;
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  auVar187._16_4_ = 0x219392ef;
  auVar187._20_4_ = 0x219392ef;
  auVar187._24_4_ = 0x219392ef;
  auVar187._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar302,auVar171);
  auVar90 = vcmpps_avx(auVar90,auVar187,1);
  auVar15 = vblendvps_avx(auVar302,auVar187,auVar90);
  auVar90 = vandps_avx(auVar294,auVar171);
  auVar90 = vcmpps_avx(auVar90,auVar187,1);
  auVar16 = vblendvps_avx(auVar294,auVar187,auVar90);
  auVar90 = vandps_avx(auVar225,auVar171);
  auVar90 = vcmpps_avx(auVar90,auVar187,1);
  auVar90 = vblendvps_avx(auVar225,auVar187,auVar90);
  auVar172._0_4_ = fVar249 * auVar20._0_4_ + fVar251 * auVar21._0_4_ + auVar22._0_4_ * fVar192;
  auVar172._4_4_ = fVar210 * auVar20._4_4_ + fVar212 * auVar21._4_4_ + auVar22._4_4_ * fVar247;
  auVar172._8_4_ = fVar250 * auVar20._8_4_ + fVar252 * auVar21._8_4_ + auVar22._8_4_ * fVar209;
  auVar172._12_4_ = fVar211 * auVar20._12_4_ + fVar213 * auVar21._12_4_ + auVar22._12_4_ * fVar248;
  auVar172._16_4_ = fVar249 * auVar20._16_4_ + fVar251 * auVar21._16_4_ + auVar22._16_4_ * fVar192;
  auVar172._20_4_ = fVar210 * auVar20._20_4_ + fVar212 * auVar21._20_4_ + auVar22._20_4_ * fVar247;
  auVar172._24_4_ = fVar250 * auVar20._24_4_ + fVar252 * auVar21._24_4_ + auVar22._24_4_ * fVar209;
  auVar172._28_4_ = fVar234 + fVar214;
  auVar17 = vrcpps_avx(auVar15);
  fVar234 = auVar17._0_4_;
  fVar247 = auVar17._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar247;
  auVar18._0_4_ = auVar15._0_4_ * fVar234;
  fVar248 = auVar17._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar248;
  fVar249 = auVar17._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar249;
  fVar250 = auVar17._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar250;
  fVar251 = auVar17._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar251;
  fVar252 = auVar17._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar252;
  auVar18._28_4_ = fVar214;
  auVar273._8_4_ = 0x3f800000;
  auVar273._0_8_ = 0x3f8000003f800000;
  auVar273._12_4_ = 0x3f800000;
  auVar273._16_4_ = 0x3f800000;
  auVar273._20_4_ = 0x3f800000;
  auVar273._24_4_ = 0x3f800000;
  auVar273._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar273,auVar18);
  auVar15 = vrcpps_avx(auVar16);
  fVar234 = fVar234 + fVar234 * auVar18._0_4_;
  fVar247 = fVar247 + fVar247 * auVar18._4_4_;
  fVar248 = fVar248 + fVar248 * auVar18._8_4_;
  fVar249 = fVar249 + fVar249 * auVar18._12_4_;
  fVar250 = fVar250 + fVar250 * auVar18._16_4_;
  fVar251 = fVar251 + fVar251 * auVar18._20_4_;
  fVar252 = fVar252 + fVar252 * auVar18._24_4_;
  fVar192 = auVar15._0_4_;
  fVar209 = auVar15._4_4_;
  auVar19._4_4_ = auVar16._4_4_ * fVar209;
  auVar19._0_4_ = auVar16._0_4_ * fVar192;
  fVar214 = auVar15._8_4_;
  auVar19._8_4_ = auVar16._8_4_ * fVar214;
  fVar210 = auVar15._12_4_;
  auVar19._12_4_ = auVar16._12_4_ * fVar210;
  fVar211 = auVar15._16_4_;
  auVar19._16_4_ = auVar16._16_4_ * fVar211;
  fVar212 = auVar15._20_4_;
  auVar19._20_4_ = auVar16._20_4_ * fVar212;
  fVar213 = auVar15._24_4_;
  auVar19._24_4_ = auVar16._24_4_ * fVar213;
  auVar19._28_4_ = auVar17._28_4_;
  auVar15 = vsubps_avx(auVar273,auVar19);
  fVar192 = fVar192 + fVar192 * auVar15._0_4_;
  fVar209 = fVar209 + fVar209 * auVar15._4_4_;
  fVar214 = fVar214 + fVar214 * auVar15._8_4_;
  fVar210 = fVar210 + fVar210 * auVar15._12_4_;
  fVar211 = fVar211 + fVar211 * auVar15._16_4_;
  fVar212 = fVar212 + fVar212 * auVar15._20_4_;
  fVar213 = fVar213 + fVar213 * auVar15._24_4_;
  auVar15 = vrcpps_avx(auVar90);
  fVar215 = auVar15._0_4_;
  fVar227 = auVar15._4_4_;
  auVar16._4_4_ = fVar227 * auVar90._4_4_;
  auVar16._0_4_ = fVar215 * auVar90._0_4_;
  fVar228 = auVar15._8_4_;
  auVar16._8_4_ = fVar228 * auVar90._8_4_;
  fVar229 = auVar15._12_4_;
  auVar16._12_4_ = fVar229 * auVar90._12_4_;
  fVar230 = auVar15._16_4_;
  auVar16._16_4_ = fVar230 * auVar90._16_4_;
  fVar232 = auVar15._20_4_;
  auVar16._20_4_ = fVar232 * auVar90._20_4_;
  fVar233 = auVar15._24_4_;
  auVar16._24_4_ = fVar233 * auVar90._24_4_;
  auVar16._28_4_ = auVar90._28_4_;
  auVar90 = vsubps_avx(auVar273,auVar16);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar68 * 7 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar220);
  fVar215 = fVar215 + fVar215 * auVar90._0_4_;
  fVar227 = fVar227 + fVar227 * auVar90._4_4_;
  fVar228 = fVar228 + fVar228 * auVar90._8_4_;
  fVar229 = fVar229 + fVar229 * auVar90._12_4_;
  fVar230 = fVar230 + fVar230 * auVar90._16_4_;
  fVar232 = fVar232 + fVar232 * auVar90._20_4_;
  fVar233 = fVar233 + fVar233 * auVar90._24_4_;
  auVar91._16_16_ = auVar220;
  auVar91._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar90 = vsubps_avx(auVar90,auVar125);
  auVar74._0_4_ = fVar234 * auVar90._0_4_;
  auVar74._4_4_ = fVar247 * auVar90._4_4_;
  auVar74._8_4_ = fVar248 * auVar90._8_4_;
  auVar74._12_4_ = fVar249 * auVar90._12_4_;
  auVar17._16_4_ = fVar250 * auVar90._16_4_;
  auVar17._0_16_ = auVar74;
  auVar17._20_4_ = fVar251 * auVar90._20_4_;
  auVar17._24_4_ = fVar252 * auVar90._24_4_;
  auVar17._28_4_ = auVar90._28_4_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar79 = vpmovsxwd_avx(auVar155);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar68 * 9 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar6);
  auVar188._16_16_ = auVar220;
  auVar188._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar188);
  auVar90 = vsubps_avx(auVar90,auVar125);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar68 * 0xe + 6);
  auVar79 = vpmovsxwd_avx(auVar7);
  auVar102._0_4_ = fVar234 * auVar90._0_4_;
  auVar102._4_4_ = fVar247 * auVar90._4_4_;
  auVar102._8_4_ = fVar248 * auVar90._8_4_;
  auVar102._12_4_ = fVar249 * auVar90._12_4_;
  auVar20._16_4_ = fVar250 * auVar90._16_4_;
  auVar20._0_16_ = auVar102;
  auVar20._20_4_ = fVar251 * auVar90._20_4_;
  auVar20._24_4_ = fVar252 * auVar90._24_4_;
  auVar20._28_4_ = auVar90._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar68 * 0xe + 0xe);
  auVar220 = vpmovsxwd_avx(auVar8);
  auVar189._16_16_ = auVar220;
  auVar189._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar189);
  auVar90 = vsubps_avx(auVar90,auVar158);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar79 = vpmovsxwd_avx(auVar120);
  auVar174._0_4_ = fVar192 * auVar90._0_4_;
  auVar174._4_4_ = fVar209 * auVar90._4_4_;
  auVar174._8_4_ = fVar214 * auVar90._8_4_;
  auVar174._12_4_ = fVar210 * auVar90._12_4_;
  auVar21._16_4_ = fVar211 * auVar90._16_4_;
  auVar21._0_16_ = auVar174;
  auVar21._20_4_ = fVar212 * auVar90._20_4_;
  auVar21._24_4_ = fVar213 * auVar90._24_4_;
  auVar21._28_4_ = auVar90._28_4_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar108);
  auVar244._16_16_ = auVar220;
  auVar244._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar244);
  auVar90 = vsubps_avx(auVar90,auVar158);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar68 * 0x15 + 6);
  auVar79 = vpmovsxwd_avx(auVar141);
  auVar134._0_4_ = fVar192 * auVar90._0_4_;
  auVar134._4_4_ = fVar209 * auVar90._4_4_;
  auVar134._8_4_ = fVar214 * auVar90._8_4_;
  auVar134._12_4_ = fVar210 * auVar90._12_4_;
  auVar22._16_4_ = fVar211 * auVar90._16_4_;
  auVar22._0_16_ = auVar134;
  auVar22._20_4_ = fVar212 * auVar90._20_4_;
  auVar22._24_4_ = fVar213 * auVar90._24_4_;
  auVar22._28_4_ = auVar90._28_4_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar68 * 0x15 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar109);
  auVar206._16_16_ = auVar220;
  auVar206._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar206);
  auVar90 = vsubps_avx(auVar90,auVar172);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 6);
  auVar79 = vpmovsxwd_avx(auVar231);
  auVar193._0_4_ = fVar215 * auVar90._0_4_;
  auVar193._4_4_ = fVar227 * auVar90._4_4_;
  auVar193._8_4_ = fVar228 * auVar90._8_4_;
  auVar193._12_4_ = fVar229 * auVar90._12_4_;
  auVar23._16_4_ = fVar230 * auVar90._16_4_;
  auVar23._0_16_ = auVar193;
  auVar23._20_4_ = fVar232 * auVar90._20_4_;
  auVar23._24_4_ = fVar233 * auVar90._24_4_;
  auVar23._28_4_ = auVar90._28_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar9);
  auVar245._16_16_ = auVar220;
  auVar245._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar245);
  auVar90 = vsubps_avx(auVar90,auVar172);
  auVar163._0_4_ = fVar215 * auVar90._0_4_;
  auVar163._4_4_ = fVar227 * auVar90._4_4_;
  auVar163._8_4_ = fVar228 * auVar90._8_4_;
  auVar163._12_4_ = fVar229 * auVar90._12_4_;
  auVar24._16_4_ = fVar230 * auVar90._16_4_;
  auVar24._0_16_ = auVar163;
  auVar24._20_4_ = fVar232 * auVar90._20_4_;
  auVar24._24_4_ = fVar233 * auVar90._24_4_;
  auVar24._28_4_ = auVar90._28_4_;
  auVar79 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar220 = vpminsd_avx(auVar74,auVar102);
  auVar284._16_16_ = auVar79;
  auVar284._0_16_ = auVar220;
  auVar79 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar220 = vpminsd_avx(auVar174,auVar134);
  auVar295._16_16_ = auVar79;
  auVar295._0_16_ = auVar220;
  auVar90 = vmaxps_avx(auVar284,auVar295);
  auVar79 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar220 = vpminsd_avx(auVar193,auVar163);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar333._4_4_ = uVar73;
  auVar333._0_4_ = uVar73;
  auVar333._8_4_ = uVar73;
  auVar333._12_4_ = uVar73;
  auVar333._16_4_ = uVar73;
  auVar333._20_4_ = uVar73;
  auVar333._24_4_ = uVar73;
  auVar333._28_4_ = uVar73;
  auVar313._16_16_ = auVar79;
  auVar313._0_16_ = auVar220;
  auVar15 = vmaxps_avx(auVar313,auVar333);
  auVar90 = vmaxps_avx(auVar90,auVar15);
  local_300._4_4_ = auVar90._4_4_ * 0.99999964;
  local_300._0_4_ = auVar90._0_4_ * 0.99999964;
  local_300._8_4_ = auVar90._8_4_ * 0.99999964;
  local_300._12_4_ = auVar90._12_4_ * 0.99999964;
  local_300._16_4_ = auVar90._16_4_ * 0.99999964;
  local_300._20_4_ = auVar90._20_4_ * 0.99999964;
  local_300._24_4_ = auVar90._24_4_ * 0.99999964;
  local_300._28_4_ = auVar90._28_4_;
  auVar79 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar220 = vpmaxsd_avx(auVar74,auVar102);
  auVar92._16_16_ = auVar79;
  auVar92._0_16_ = auVar220;
  auVar79 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar220 = vpmaxsd_avx(auVar174,auVar134);
  auVar126._16_16_ = auVar79;
  auVar126._0_16_ = auVar220;
  auVar90 = vminps_avx(auVar92,auVar126);
  auVar79 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar220 = vpmaxsd_avx(auVar193,auVar163);
  auVar127._16_16_ = auVar79;
  auVar127._0_16_ = auVar220;
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar159._4_4_ = uVar73;
  auVar159._0_4_ = uVar73;
  auVar159._8_4_ = uVar73;
  auVar159._12_4_ = uVar73;
  auVar159._16_4_ = uVar73;
  auVar159._20_4_ = uVar73;
  auVar159._24_4_ = uVar73;
  auVar159._28_4_ = uVar73;
  auVar15 = vminps_avx(auVar127,auVar159);
  auVar90 = vminps_avx(auVar90,auVar15);
  auVar15._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar90._28_4_;
  auVar90 = vcmpps_avx(local_300,auVar15,2);
  auVar79 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar128._16_16_ = auVar79;
  auVar128._0_16_ = auVar79;
  auVar15 = vcvtdq2ps_avx(auVar128);
  auVar15 = vcmpps_avx(_DAT_01f7b060,auVar15,1);
  auVar90 = vandps_avx(auVar90,auVar15);
  uVar73 = vmovmskps_avx(auVar90);
  uVar68 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar73);
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  uVar65 = 1 << ((byte)k & 0x1f);
LAB_009fa78e:
  if (uVar68 == 0) {
LAB_009fc677:
    return uVar68 != 0;
  }
  lVar69 = 0;
  if (uVar68 != 0) {
    for (; (uVar68 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
    }
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar11 = (context->scene->geometries).items[uVar67].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           (ulong)*(uint *)(prim + lVar69 * 4 + 6) *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar12 + (long)pGVar11[1].intersectionFilterN * uVar72);
  fVar250 = *pfVar2;
  fVar211 = pfVar2[1];
  fVar251 = pfVar2[2];
  fVar212 = pfVar2[3];
  lVar1 = uVar72 + 1;
  auVar79 = *(undefined1 (*) [16])(lVar12 + (long)pGVar11[1].intersectionFilterN * lVar1);
  pfVar2 = (float *)(pGVar11[2].intersectionFilterN + (long)pGVar11[2].pointQueryFunc * uVar72);
  _Var13 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(pGVar11[2].intersectionFilterN + (long)pGVar11[2].pointQueryFunc * lVar1);
  auVar135._0_4_ = *pfVar3 * 0.33333334;
  auVar135._4_4_ = pfVar3[1] * 0.33333334;
  auVar135._8_4_ = pfVar3[2] * 0.33333334;
  auVar135._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)(_Var13 + (long)pGVar11[2].userPtr * uVar72);
  fVar252 = *pfVar3;
  fVar213 = pfVar3[1];
  fVar215 = pfVar3[2];
  fVar227 = pfVar3[3];
  auVar220 = *(undefined1 (*) [16])(_Var13 + (long)pGVar11[2].userPtr * lVar1);
  pfVar3 = (float *)((long)pGVar11[3].userPtr + uVar72 * *(long *)&pGVar11[3].fnumTimeSegments);
  auVar155 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar6 = vinsertps_avx(auVar155,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar228 = fVar250 + *pfVar2 * 0.33333334;
  fVar229 = fVar211 + pfVar2[1] * 0.33333334;
  fVar230 = fVar251 + pfVar2[2] * 0.33333334;
  fVar232 = fVar212 + pfVar2[3] * 0.33333334;
  auVar155 = vsubps_avx(auVar79,auVar135);
  pfVar2 = (float *)((long)pGVar11[3].userPtr + *(long *)&pGVar11[3].fnumTimeSegments * lVar1);
  auVar103._0_4_ = *pfVar2 * 0.33333334;
  auVar103._4_4_ = pfVar2[1] * 0.33333334;
  auVar103._8_4_ = pfVar2[2] * 0.33333334;
  auVar103._12_4_ = pfVar2[3] * 0.33333334;
  fVar233 = fVar252 + *pfVar3 * 0.33333334;
  fVar286 = fVar213 + pfVar3[1] * 0.33333334;
  fVar287 = fVar215 + pfVar3[2] * 0.33333334;
  fVar288 = fVar227 + pfVar3[3] * 0.33333334;
  auVar7 = vsubps_avx(auVar220,auVar103);
  fVar234 = auVar79._0_4_;
  fVar247 = auVar79._4_4_;
  fVar248 = auVar79._8_4_;
  fVar249 = auVar79._12_4_;
  fVar289 = auVar155._0_4_ * 0.0;
  fVar297 = auVar155._4_4_ * 0.0;
  fVar298 = auVar155._8_4_ * 0.0;
  fVar299 = auVar155._12_4_ * 0.0;
  fVar192 = fVar289 + fVar234 * 0.0;
  fVar209 = fVar297 + fVar247 * 0.0;
  fVar214 = fVar298 + fVar248 * 0.0;
  fVar210 = fVar299 + fVar249 * 0.0;
  fVar300 = fVar228 * 0.0;
  fVar303 = fVar229 * 0.0;
  fVar304 = fVar230 * 0.0;
  fVar305 = fVar232 * 0.0;
  local_700._0_4_ = fVar250 + fVar300 + fVar192;
  local_700._4_4_ = fVar211 + fVar303 + fVar209;
  fStack_6f8 = fVar251 + fVar304 + fVar214;
  fStack_6f4 = fVar212 + fVar305 + fVar210;
  auVar136._0_4_ = fVar228 * 3.0 + fVar192;
  auVar136._4_4_ = fVar229 * 3.0 + fVar209;
  auVar136._8_4_ = fVar230 * 3.0 + fVar214;
  auVar136._12_4_ = fVar232 * 3.0 + fVar210;
  auVar253._0_4_ = fVar250 * 3.0;
  auVar253._4_4_ = fVar211 * 3.0;
  auVar253._8_4_ = fVar251 * 3.0;
  auVar253._12_4_ = fVar212 * 3.0;
  auVar231 = vsubps_avx(auVar136,auVar253);
  fVar192 = auVar220._0_4_;
  fVar209 = auVar220._4_4_;
  fVar214 = auVar220._8_4_;
  fVar210 = auVar220._12_4_;
  fVar310 = auVar7._0_4_ * 0.0;
  fVar314 = auVar7._4_4_ * 0.0;
  fVar315 = auVar7._8_4_ * 0.0;
  fVar316 = auVar7._12_4_ * 0.0;
  fVar228 = fVar192 * 0.0 + fVar310;
  fVar229 = fVar209 * 0.0 + fVar314;
  fVar230 = fVar214 * 0.0 + fVar315;
  fVar232 = fVar210 * 0.0 + fVar316;
  fVar318 = fVar233 * 0.0;
  fVar327 = fVar286 * 0.0;
  fVar328 = fVar287 * 0.0;
  fVar329 = fVar288 * 0.0;
  auVar330._0_4_ = fVar318 + fVar228 + fVar252;
  auVar330._4_4_ = fVar327 + fVar229 + fVar213;
  auVar330._8_4_ = fVar328 + fVar230 + fVar215;
  auVar330._12_4_ = fVar329 + fVar232 + fVar227;
  auVar254._0_4_ = fVar233 * 3.0 + fVar228;
  auVar254._4_4_ = fVar286 * 3.0 + fVar229;
  auVar254._8_4_ = fVar287 * 3.0 + fVar230;
  auVar254._12_4_ = fVar288 * 3.0 + fVar232;
  auVar276._0_4_ = fVar252 * 3.0;
  auVar276._4_4_ = fVar213 * 3.0;
  auVar276._8_4_ = fVar215 * 3.0;
  auVar276._12_4_ = fVar227 * 3.0;
  auVar8 = vsubps_avx(auVar254,auVar276);
  auVar290._0_4_ = fVar250 * 0.0;
  auVar290._4_4_ = fVar211 * 0.0;
  auVar290._8_4_ = fVar251 * 0.0;
  auVar290._12_4_ = fVar212 * 0.0;
  auVar164._0_4_ = auVar290._0_4_ + fVar300 + fVar289 + fVar234;
  auVar164._4_4_ = auVar290._4_4_ + fVar303 + fVar297 + fVar247;
  auVar164._8_4_ = auVar290._8_4_ + fVar304 + fVar298 + fVar248;
  auVar164._12_4_ = auVar290._12_4_ + fVar305 + fVar299 + fVar249;
  auVar175._0_4_ = fVar234 * 3.0;
  auVar175._4_4_ = fVar247 * 3.0;
  auVar175._8_4_ = fVar248 * 3.0;
  auVar175._12_4_ = fVar249 * 3.0;
  auVar255._0_4_ = auVar155._0_4_ * 3.0;
  auVar255._4_4_ = auVar155._4_4_ * 3.0;
  auVar255._8_4_ = auVar155._8_4_ * 3.0;
  auVar255._12_4_ = auVar155._12_4_ * 3.0;
  auVar79 = vsubps_avx(auVar175,auVar255);
  auVar176._0_4_ = fVar300 + auVar79._0_4_;
  auVar176._4_4_ = fVar303 + auVar79._4_4_;
  auVar176._8_4_ = fVar304 + auVar79._8_4_;
  auVar176._12_4_ = fVar305 + auVar79._12_4_;
  auVar9 = vsubps_avx(auVar176,auVar290);
  auVar194._0_4_ = fVar252 * 0.0;
  auVar194._4_4_ = fVar213 * 0.0;
  auVar194._8_4_ = fVar215 * 0.0;
  auVar194._12_4_ = fVar227 * 0.0;
  auVar265._0_4_ = fVar318 + fVar310 + fVar192 + auVar194._0_4_;
  auVar265._4_4_ = fVar327 + fVar314 + fVar209 + auVar194._4_4_;
  auVar265._8_4_ = fVar328 + fVar315 + fVar214 + auVar194._8_4_;
  auVar265._12_4_ = fVar329 + fVar316 + fVar210 + auVar194._12_4_;
  auVar217._0_4_ = fVar192 * 3.0;
  auVar217._4_4_ = fVar209 * 3.0;
  auVar217._8_4_ = fVar214 * 3.0;
  auVar217._12_4_ = fVar210 * 3.0;
  auVar235._0_4_ = auVar7._0_4_ * 3.0;
  auVar235._4_4_ = auVar7._4_4_ * 3.0;
  auVar235._8_4_ = auVar7._8_4_ * 3.0;
  auVar235._12_4_ = auVar7._12_4_ * 3.0;
  auVar79 = vsubps_avx(auVar217,auVar235);
  auVar218._0_4_ = fVar318 + auVar79._0_4_;
  auVar218._4_4_ = fVar327 + auVar79._4_4_;
  auVar218._8_4_ = fVar328 + auVar79._8_4_;
  auVar218._12_4_ = fVar329 + auVar79._12_4_;
  auVar120 = vsubps_avx(auVar218,auVar194);
  auVar79 = vshufps_avx(auVar231,auVar231,0xc9);
  auVar220 = vshufps_avx(auVar330,auVar330,0xc9);
  fVar228 = auVar231._0_4_;
  auVar236._0_4_ = fVar228 * auVar220._0_4_;
  fVar229 = auVar231._4_4_;
  auVar236._4_4_ = fVar229 * auVar220._4_4_;
  fVar230 = auVar231._8_4_;
  auVar236._8_4_ = fVar230 * auVar220._8_4_;
  fVar232 = auVar231._12_4_;
  auVar236._12_4_ = fVar232 * auVar220._12_4_;
  auVar256._0_4_ = auVar330._0_4_ * auVar79._0_4_;
  auVar256._4_4_ = auVar330._4_4_ * auVar79._4_4_;
  auVar256._8_4_ = auVar330._8_4_ * auVar79._8_4_;
  auVar256._12_4_ = auVar330._12_4_ * auVar79._12_4_;
  auVar220 = vsubps_avx(auVar256,auVar236);
  auVar155 = vshufps_avx(auVar220,auVar220,0xc9);
  auVar220 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar237._0_4_ = fVar228 * auVar220._0_4_;
  auVar237._4_4_ = fVar229 * auVar220._4_4_;
  auVar237._8_4_ = fVar230 * auVar220._8_4_;
  auVar237._12_4_ = fVar232 * auVar220._12_4_;
  auVar195._0_4_ = auVar8._0_4_ * auVar79._0_4_;
  auVar195._4_4_ = auVar8._4_4_ * auVar79._4_4_;
  auVar195._8_4_ = auVar8._8_4_ * auVar79._8_4_;
  auVar195._12_4_ = auVar8._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar195,auVar237);
  auVar7 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar79 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar220 = vshufps_avx(auVar265,auVar265,0xc9);
  fVar233 = auVar9._0_4_;
  auVar196._0_4_ = fVar233 * auVar220._0_4_;
  fVar286 = auVar9._4_4_;
  auVar196._4_4_ = fVar286 * auVar220._4_4_;
  fVar287 = auVar9._8_4_;
  auVar196._8_4_ = fVar287 * auVar220._8_4_;
  fVar288 = auVar9._12_4_;
  auVar196._12_4_ = fVar288 * auVar220._12_4_;
  auVar266._0_4_ = auVar265._0_4_ * auVar79._0_4_;
  auVar266._4_4_ = auVar265._4_4_ * auVar79._4_4_;
  auVar266._8_4_ = auVar265._8_4_ * auVar79._8_4_;
  auVar266._12_4_ = auVar265._12_4_ * auVar79._12_4_;
  auVar220 = vsubps_avx(auVar266,auVar196);
  auVar8 = vshufps_avx(auVar220,auVar220,0xc9);
  auVar220 = vshufps_avx(auVar120,auVar120,0xc9);
  auVar267._0_4_ = auVar220._0_4_ * fVar233;
  auVar267._4_4_ = auVar220._4_4_ * fVar286;
  auVar267._8_4_ = auVar220._8_4_ * fVar287;
  auVar267._12_4_ = auVar220._12_4_ * fVar288;
  auVar219._0_4_ = auVar79._0_4_ * auVar120._0_4_;
  auVar219._4_4_ = auVar79._4_4_ * auVar120._4_4_;
  auVar219._8_4_ = auVar79._8_4_ * auVar120._8_4_;
  auVar219._12_4_ = auVar79._12_4_ * auVar120._12_4_;
  auVar79 = vdpps_avx(auVar155,auVar155,0x7f);
  auVar220 = vsubps_avx(auVar219,auVar267);
  auVar120 = vshufps_avx(auVar220,auVar220,0xc9);
  fVar248 = auVar79._0_4_;
  auVar141 = ZEXT416((uint)fVar248);
  auVar220 = vrsqrtss_avx(auVar141,auVar141);
  fVar234 = auVar220._0_4_;
  auVar220 = ZEXT416((uint)(fVar234 * 1.5 - fVar248 * 0.5 * fVar234 * fVar234 * fVar234));
  auVar108 = vshufps_avx(auVar220,auVar220,0);
  fVar234 = auVar155._0_4_ * auVar108._0_4_;
  fVar192 = auVar155._4_4_ * auVar108._4_4_;
  fVar247 = auVar155._8_4_ * auVar108._8_4_;
  fVar209 = auVar155._12_4_ * auVar108._12_4_;
  auVar220 = vdpps_avx(auVar155,auVar7,0x7f);
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar277._0_4_ = auVar79._0_4_ * auVar7._0_4_;
  auVar277._4_4_ = auVar79._4_4_ * auVar7._4_4_;
  auVar277._8_4_ = auVar79._8_4_ * auVar7._8_4_;
  auVar277._12_4_ = auVar79._12_4_ * auVar7._12_4_;
  auVar79 = vshufps_avx(auVar220,auVar220,0);
  auVar257._0_4_ = auVar79._0_4_ * auVar155._0_4_;
  auVar257._4_4_ = auVar79._4_4_ * auVar155._4_4_;
  auVar257._8_4_ = auVar79._8_4_ * auVar155._8_4_;
  auVar257._12_4_ = auVar79._12_4_ * auVar155._12_4_;
  auVar74 = vsubps_avx(auVar277,auVar257);
  auVar79 = vrcpss_avx(auVar141,auVar141);
  auVar79 = ZEXT416((uint)(auVar79._0_4_ * (2.0 - fVar248 * auVar79._0_4_)));
  auVar7 = vshufps_avx(auVar79,auVar79,0);
  auVar220 = vdpps_avx(auVar8,auVar8,0x7f);
  auVar79 = vblendps_avx(auVar220,_DAT_01f45a50,0xe);
  auVar155 = vrsqrtss_avx(auVar79,auVar79);
  fVar248 = auVar155._0_4_;
  auVar155 = vdpps_avx(auVar8,auVar120,0x7f);
  auVar141 = ZEXT416((uint)(fVar248 * 1.5 - auVar220._0_4_ * 0.5 * fVar248 * fVar248 * fVar248));
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  fVar248 = auVar141._0_4_ * auVar8._0_4_;
  fVar214 = auVar141._4_4_ * auVar8._4_4_;
  fVar249 = auVar141._8_4_ * auVar8._8_4_;
  fVar210 = auVar141._12_4_ * auVar8._12_4_;
  auVar109 = vshufps_avx(auVar220,auVar220,0);
  auVar238._0_4_ = auVar109._0_4_ * auVar120._0_4_;
  auVar238._4_4_ = auVar109._4_4_ * auVar120._4_4_;
  auVar238._8_4_ = auVar109._8_4_ * auVar120._8_4_;
  auVar238._12_4_ = auVar109._12_4_ * auVar120._12_4_;
  auVar155 = vshufps_avx(auVar155,auVar155,0);
  auVar197._0_4_ = auVar155._0_4_ * auVar8._0_4_;
  auVar197._4_4_ = auVar155._4_4_ * auVar8._4_4_;
  auVar197._8_4_ = auVar155._8_4_ * auVar8._8_4_;
  auVar197._12_4_ = auVar155._12_4_ * auVar8._12_4_;
  auVar8 = vsubps_avx(auVar238,auVar197);
  auVar79 = vrcpss_avx(auVar79,auVar79);
  auVar79 = ZEXT416((uint)((2.0 - auVar220._0_4_ * auVar79._0_4_) * auVar79._0_4_));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar220 = vshufps_avx(_local_700,_local_700,0xff);
  auVar268._0_4_ = auVar220._0_4_ * fVar234;
  auVar268._4_4_ = auVar220._4_4_ * fVar192;
  auVar268._8_4_ = auVar220._8_4_ * fVar247;
  auVar268._12_4_ = auVar220._12_4_ * fVar209;
  _local_4e0 = vsubps_avx(_local_700,auVar268);
  auVar155 = vshufps_avx(auVar231,auVar231,0xff);
  auVar221._0_4_ =
       auVar155._0_4_ * fVar234 + auVar108._0_4_ * auVar74._0_4_ * auVar7._0_4_ * auVar220._0_4_;
  auVar221._4_4_ =
       auVar155._4_4_ * fVar192 + auVar108._4_4_ * auVar74._4_4_ * auVar7._4_4_ * auVar220._4_4_;
  auVar221._8_4_ =
       auVar155._8_4_ * fVar247 + auVar108._8_4_ * auVar74._8_4_ * auVar7._8_4_ * auVar220._8_4_;
  auVar221._12_4_ =
       auVar155._12_4_ * fVar209 +
       auVar108._12_4_ * auVar74._12_4_ * auVar7._12_4_ * auVar220._12_4_;
  auVar7 = vsubps_avx(auVar231,auVar221);
  local_4f0._0_4_ = auVar268._0_4_ + (float)local_700._0_4_;
  local_4f0._4_4_ = auVar268._4_4_ + (float)local_700._4_4_;
  fStack_4e8 = auVar268._8_4_ + fStack_6f8;
  fStack_4e4 = auVar268._12_4_ + fStack_6f4;
  auVar220 = vshufps_avx(auVar164,auVar164,0xff);
  auVar137._0_4_ = fVar248 * auVar220._0_4_;
  auVar137._4_4_ = fVar214 * auVar220._4_4_;
  auVar137._8_4_ = fVar249 * auVar220._8_4_;
  auVar137._12_4_ = fVar210 * auVar220._12_4_;
  _local_500 = vsubps_avx(auVar164,auVar137);
  auVar155 = vshufps_avx(auVar9,auVar9,0xff);
  auVar104._0_4_ =
       fVar248 * auVar155._0_4_ + auVar220._0_4_ * auVar141._0_4_ * auVar8._0_4_ * auVar79._0_4_;
  auVar104._4_4_ =
       fVar214 * auVar155._4_4_ + auVar220._4_4_ * auVar141._4_4_ * auVar8._4_4_ * auVar79._4_4_;
  auVar104._8_4_ =
       fVar249 * auVar155._8_4_ + auVar220._8_4_ * auVar141._8_4_ * auVar8._8_4_ * auVar79._8_4_;
  auVar104._12_4_ =
       fVar210 * auVar155._12_4_ +
       auVar220._12_4_ * auVar141._12_4_ * auVar8._12_4_ * auVar79._12_4_;
  auVar8 = vsubps_avx(auVar9,auVar104);
  local_510._0_4_ = auVar164._0_4_ + auVar137._0_4_;
  local_510._4_4_ = auVar164._4_4_ + auVar137._4_4_;
  fStack_508 = auVar164._8_4_ + auVar137._8_4_;
  fStack_504 = auVar164._12_4_ + auVar137._12_4_;
  local_520._0_4_ = local_4e0._0_4_ + auVar7._0_4_ * 0.33333334;
  local_520._4_4_ = local_4e0._4_4_ + auVar7._4_4_ * 0.33333334;
  fStack_518 = local_4e0._8_4_ + auVar7._8_4_ * 0.33333334;
  fStack_514 = local_4e0._12_4_ + auVar7._12_4_ * 0.33333334;
  local_3c0 = vsubps_avx(_local_4e0,auVar6);
  auVar220 = vmovsldup_avx(local_3c0);
  auVar79 = vmovshdup_avx(local_3c0);
  auVar155 = vshufps_avx(local_3c0,local_3c0,0xaa);
  fVar234 = pre->ray_space[k].vx.field_0.m128[0];
  fVar192 = pre->ray_space[k].vx.field_0.m128[1];
  fVar247 = pre->ray_space[k].vx.field_0.m128[2];
  fVar209 = pre->ray_space[k].vx.field_0.m128[3];
  fVar248 = pre->ray_space[k].vy.field_0.m128[0];
  fVar214 = pre->ray_space[k].vy.field_0.m128[1];
  fVar249 = pre->ray_space[k].vy.field_0.m128[2];
  fVar210 = pre->ray_space[k].vy.field_0.m128[3];
  fVar250 = pre->ray_space[k].vz.field_0.m128[0];
  fVar211 = pre->ray_space[k].vz.field_0.m128[1];
  fVar251 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  fVar252 = fVar234 * auVar220._0_4_ + auVar155._0_4_ * fVar250 + fVar248 * auVar79._0_4_;
  fVar215 = fVar192 * auVar220._4_4_ + auVar155._4_4_ * fVar211 + fVar214 * auVar79._4_4_;
  local_700._4_4_ = fVar215;
  local_700._0_4_ = fVar252;
  fStack_6f8 = fVar247 * auVar220._8_4_ + auVar155._8_4_ * fVar251 + fVar249 * auVar79._8_4_;
  fStack_6f4 = fVar209 * auVar220._12_4_ + auVar155._12_4_ * fVar212 + fVar210 * auVar79._12_4_;
  local_3d0 = vsubps_avx(_local_520,auVar6);
  auVar155 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar79 = vmovshdup_avx(local_3d0);
  auVar220 = vmovsldup_avx(local_3d0);
  fVar213 = auVar220._0_4_ * fVar234 + auVar79._0_4_ * fVar248 + fVar250 * auVar155._0_4_;
  fVar227 = auVar220._4_4_ * fVar192 + auVar79._4_4_ * fVar214 + fVar211 * auVar155._4_4_;
  local_6c0._4_4_ = fVar227;
  local_6c0._0_4_ = fVar213;
  fStack_6b8 = auVar220._8_4_ * fVar247 + auVar79._8_4_ * fVar249 + fVar251 * auVar155._8_4_;
  fStack_6b4 = auVar220._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + fVar212 * auVar155._12_4_;
  auVar198._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar8._12_4_ * 0.33333334;
  _local_530 = vsubps_avx(_local_500,auVar198);
  local_3e0 = vsubps_avx(_local_530,auVar6);
  auVar155 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar79 = vmovshdup_avx(local_3e0);
  auVar220 = vmovsldup_avx(local_3e0);
  auVar319._0_4_ = auVar220._0_4_ * fVar234 + auVar79._0_4_ * fVar248 + fVar250 * auVar155._0_4_;
  auVar319._4_4_ = auVar220._4_4_ * fVar192 + auVar79._4_4_ * fVar214 + fVar211 * auVar155._4_4_;
  auVar319._8_4_ = auVar220._8_4_ * fVar247 + auVar79._8_4_ * fVar249 + fVar251 * auVar155._8_4_;
  auVar319._12_4_ = auVar220._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + fVar212 * auVar155._12_4_
  ;
  local_3f0 = vsubps_avx(_local_500,auVar6);
  auVar155 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar79 = vmovshdup_avx(local_3f0);
  auVar220 = vmovsldup_avx(local_3f0);
  auVar311._0_4_ = auVar220._0_4_ * fVar234 + auVar79._0_4_ * fVar248 + auVar155._0_4_ * fVar250;
  auVar311._4_4_ = auVar220._4_4_ * fVar192 + auVar79._4_4_ * fVar214 + auVar155._4_4_ * fVar211;
  auVar311._8_4_ = auVar220._8_4_ * fVar247 + auVar79._8_4_ * fVar249 + auVar155._8_4_ * fVar251;
  auVar311._12_4_ = auVar220._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + auVar155._12_4_ * fVar212
  ;
  local_400 = vsubps_avx(_local_4f0,auVar6);
  auVar155 = vshufps_avx(local_400,local_400,0xaa);
  auVar79 = vmovshdup_avx(local_400);
  auVar220 = vmovsldup_avx(local_400);
  auVar278._0_4_ = auVar220._0_4_ * fVar234 + auVar79._0_4_ * fVar248 + auVar155._0_4_ * fVar250;
  auVar278._4_4_ = auVar220._4_4_ * fVar192 + auVar79._4_4_ * fVar214 + auVar155._4_4_ * fVar211;
  auVar278._8_4_ = auVar220._8_4_ * fVar247 + auVar79._8_4_ * fVar249 + auVar155._8_4_ * fVar251;
  auVar278._12_4_ = auVar220._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + auVar155._12_4_ * fVar212
  ;
  local_540._0_4_ = (float)local_4f0._0_4_ + (fVar228 + auVar221._0_4_) * 0.33333334;
  local_540._4_4_ = (float)local_4f0._4_4_ + (fVar229 + auVar221._4_4_) * 0.33333334;
  fStack_538 = fStack_4e8 + (fVar230 + auVar221._8_4_) * 0.33333334;
  fStack_534 = fStack_4e4 + (fVar232 + auVar221._12_4_) * 0.33333334;
  local_410 = vsubps_avx(_local_540,auVar6);
  auVar155 = vshufps_avx(local_410,local_410,0xaa);
  auVar79 = vmovshdup_avx(local_410);
  auVar220 = vmovsldup_avx(local_410);
  auVar258._0_4_ = auVar220._0_4_ * fVar234 + auVar79._0_4_ * fVar248 + auVar155._0_4_ * fVar250;
  auVar258._4_4_ = auVar220._4_4_ * fVar192 + auVar79._4_4_ * fVar214 + auVar155._4_4_ * fVar211;
  auVar258._8_4_ = auVar220._8_4_ * fVar247 + auVar79._8_4_ * fVar249 + auVar155._8_4_ * fVar251;
  auVar258._12_4_ = auVar220._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + auVar155._12_4_ * fVar212
  ;
  auVar239._0_4_ = (fVar233 + auVar104._0_4_) * 0.33333334;
  auVar239._4_4_ = (fVar286 + auVar104._4_4_) * 0.33333334;
  auVar239._8_4_ = (fVar287 + auVar104._8_4_) * 0.33333334;
  auVar239._12_4_ = (fVar288 + auVar104._12_4_) * 0.33333334;
  _local_450 = vsubps_avx(_local_510,auVar239);
  local_420 = vsubps_avx(_local_450,auVar6);
  auVar155 = vshufps_avx(local_420,local_420,0xaa);
  auVar79 = vmovshdup_avx(local_420);
  auVar220 = vmovsldup_avx(local_420);
  auVar269._0_4_ = auVar220._0_4_ * fVar234 + auVar79._0_4_ * fVar248 + fVar250 * auVar155._0_4_;
  auVar269._4_4_ = auVar220._4_4_ * fVar192 + auVar79._4_4_ * fVar214 + fVar211 * auVar155._4_4_;
  auVar269._8_4_ = auVar220._8_4_ * fVar247 + auVar79._8_4_ * fVar249 + fVar251 * auVar155._8_4_;
  auVar269._12_4_ = auVar220._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + fVar212 * auVar155._12_4_
  ;
  local_430 = vsubps_avx(_local_510,auVar6);
  auVar155 = vshufps_avx(local_430,local_430,0xaa);
  auVar79 = vmovshdup_avx(local_430);
  auVar220 = vmovsldup_avx(local_430);
  auVar105._0_4_ = fVar234 * auVar220._0_4_ + fVar248 * auVar79._0_4_ + fVar250 * auVar155._0_4_;
  auVar105._4_4_ = fVar192 * auVar220._4_4_ + fVar214 * auVar79._4_4_ + fVar211 * auVar155._4_4_;
  auVar105._8_4_ = fVar247 * auVar220._8_4_ + fVar249 * auVar79._8_4_ + fVar251 * auVar155._8_4_;
  auVar105._12_4_ = fVar209 * auVar220._12_4_ + fVar210 * auVar79._12_4_ + fVar212 * auVar155._12_4_
  ;
  auVar6 = vmovlhps_avx(_local_700,auVar278);
  auVar7 = vmovlhps_avx(_local_6c0,auVar258);
  auVar8 = vmovlhps_avx(auVar319,auVar269);
  _local_3a0 = vmovlhps_avx(auVar311,auVar105);
  auVar79 = vminps_avx(auVar6,auVar7);
  auVar220 = vminps_avx(auVar8,_local_3a0);
  auVar155 = vminps_avx(auVar79,auVar220);
  auVar79 = vmaxps_avx(auVar6,auVar7);
  auVar220 = vmaxps_avx(auVar8,_local_3a0);
  auVar79 = vmaxps_avx(auVar79,auVar220);
  auVar220 = vshufpd_avx(auVar155,auVar155,3);
  auVar155 = vminps_avx(auVar155,auVar220);
  auVar220 = vshufpd_avx(auVar79,auVar79,3);
  auVar220 = vmaxps_avx(auVar79,auVar220);
  auVar222._8_4_ = 0x7fffffff;
  auVar222._0_8_ = 0x7fffffff7fffffff;
  auVar222._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar155,auVar222);
  auVar220 = vandps_avx(auVar220,auVar222);
  auVar79 = vmaxps_avx(auVar79,auVar220);
  auVar220 = vmovshdup_avx(auVar79);
  auVar79 = vmaxss_avx(auVar220,auVar79);
  fVar234 = auVar79._0_4_ * 9.536743e-07;
  local_3b0 = ZEXT416((uint)fVar234);
  auVar79 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
  local_1c0._16_16_ = auVar79;
  local_1c0._0_16_ = auVar79;
  auVar75._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
  auVar75._8_4_ = auVar79._8_4_ ^ 0x80000000;
  auVar75._12_4_ = auVar79._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar75;
  local_1e0._0_16_ = auVar75;
  auVar79 = vpshufd_avx(ZEXT416(uVar67),0);
  local_320._16_16_ = auVar79;
  local_320._0_16_ = auVar79;
  auVar79 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar69 * 4 + 6)),0);
  local_340._16_16_ = auVar79;
  local_340._0_16_ = auVar79;
  bVar63 = false;
  uVar72 = 0;
  fVar234 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar7,auVar6);
  _local_380 = vsubps_avx(auVar8,auVar7);
  _local_390 = vsubps_avx(_local_3a0,auVar8);
  _local_460 = vsubps_avx(_local_4f0,_local_4e0);
  _local_470 = vsubps_avx(_local_540,_local_520);
  _local_480 = vsubps_avx(_local_450,_local_530);
  _local_490 = vsubps_avx(_local_510,_local_500);
  auVar326 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar334 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_009faf7a:
  local_440 = auVar334._0_16_;
  auVar101 = auVar326._0_16_;
  auVar79 = vshufps_avx(auVar101,auVar101,0x50);
  auVar320._8_4_ = 0x3f800000;
  auVar320._0_8_ = 0x3f8000003f800000;
  auVar320._12_4_ = 0x3f800000;
  auVar325._16_4_ = 0x3f800000;
  auVar325._0_16_ = auVar320;
  auVar325._20_4_ = 0x3f800000;
  auVar325._24_4_ = 0x3f800000;
  auVar325._28_4_ = 0x3f800000;
  auVar220 = vsubps_avx(auVar320,auVar79);
  fVar192 = auVar79._0_4_;
  fVar247 = auVar79._4_4_;
  fVar209 = auVar79._8_4_;
  fVar248 = auVar79._12_4_;
  fVar214 = auVar220._0_4_;
  fVar249 = auVar220._4_4_;
  fVar210 = auVar220._8_4_;
  fVar250 = auVar220._12_4_;
  auVar165._0_4_ = auVar278._0_4_ * fVar192 + fVar214 * fVar252;
  auVar165._4_4_ = auVar278._4_4_ * fVar247 + fVar249 * fVar215;
  auVar165._8_4_ = auVar278._0_4_ * fVar209 + fVar210 * fVar252;
  auVar165._12_4_ = auVar278._4_4_ * fVar248 + fVar250 * fVar215;
  auVar138._0_4_ = auVar258._0_4_ * fVar192 + fVar214 * fVar213;
  auVar138._4_4_ = auVar258._4_4_ * fVar247 + fVar249 * fVar227;
  auVar138._8_4_ = auVar258._0_4_ * fVar209 + fVar210 * fVar213;
  auVar138._12_4_ = auVar258._4_4_ * fVar248 + fVar250 * fVar227;
  auVar240._0_4_ = auVar269._0_4_ * fVar192 + auVar319._0_4_ * fVar214;
  auVar240._4_4_ = auVar269._4_4_ * fVar247 + auVar319._4_4_ * fVar249;
  auVar240._8_4_ = auVar269._0_4_ * fVar209 + auVar319._0_4_ * fVar210;
  auVar240._12_4_ = auVar269._4_4_ * fVar248 + auVar319._4_4_ * fVar250;
  auVar177._0_4_ = auVar105._0_4_ * fVar192 + auVar311._0_4_ * fVar214;
  auVar177._4_4_ = auVar105._4_4_ * fVar247 + auVar311._4_4_ * fVar249;
  auVar177._8_4_ = auVar105._0_4_ * fVar209 + auVar311._0_4_ * fVar210;
  auVar177._12_4_ = auVar105._4_4_ * fVar248 + auVar311._4_4_ * fVar250;
  auVar79 = vmovshdup_avx(local_440);
  auVar220 = vshufps_avx(local_440,local_440,0);
  auVar274._16_16_ = auVar220;
  auVar274._0_16_ = auVar220;
  auVar155 = vshufps_avx(local_440,local_440,0x55);
  auVar94._16_16_ = auVar155;
  auVar94._0_16_ = auVar155;
  auVar90 = vsubps_avx(auVar94,auVar274);
  auVar155 = vshufps_avx(auVar165,auVar165,0);
  auVar120 = vshufps_avx(auVar165,auVar165,0x55);
  auVar108 = vshufps_avx(auVar138,auVar138,0);
  auVar141 = vshufps_avx(auVar138,auVar138,0x55);
  auVar109 = vshufps_avx(auVar240,auVar240,0);
  auVar231 = vshufps_avx(auVar240,auVar240,0x55);
  auVar9 = vshufps_avx(auVar177,auVar177,0);
  auVar74 = vshufps_avx(auVar177,auVar177,0x55);
  auVar79 = ZEXT416((uint)((auVar79._0_4_ - auVar334._0_4_) * 0.04761905));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar285._0_4_ = auVar220._0_4_ + auVar90._0_4_ * 0.0;
  auVar285._4_4_ = auVar220._4_4_ + auVar90._4_4_ * 0.14285715;
  auVar285._8_4_ = auVar220._8_4_ + auVar90._8_4_ * 0.2857143;
  auVar285._12_4_ = auVar220._12_4_ + auVar90._12_4_ * 0.42857146;
  auVar285._16_4_ = auVar220._0_4_ + auVar90._16_4_ * 0.5714286;
  auVar285._20_4_ = auVar220._4_4_ + auVar90._20_4_ * 0.71428573;
  auVar285._24_4_ = auVar220._8_4_ + auVar90._24_4_ * 0.8571429;
  auVar285._28_4_ = auVar220._12_4_ + auVar90._28_4_;
  auVar17 = vsubps_avx(auVar325,auVar285);
  fVar192 = auVar108._0_4_;
  fVar209 = auVar108._4_4_;
  fVar214 = auVar108._8_4_;
  fVar210 = auVar108._12_4_;
  fVar314 = auVar17._0_4_;
  fVar315 = auVar17._4_4_;
  fVar316 = auVar17._8_4_;
  fVar318 = auVar17._12_4_;
  fVar327 = auVar17._16_4_;
  fVar328 = auVar17._20_4_;
  fVar329 = auVar17._24_4_;
  fVar297 = auVar141._0_4_;
  fVar299 = auVar141._4_4_;
  fVar303 = auVar141._8_4_;
  fVar305 = auVar141._12_4_;
  fVar317 = auVar120._12_4_ + 1.0;
  fVar286 = auVar109._0_4_;
  fVar287 = auVar109._4_4_;
  fVar288 = auVar109._8_4_;
  fVar289 = auVar109._12_4_;
  fVar211 = fVar286 * auVar285._0_4_ + fVar314 * fVar192;
  fVar251 = fVar287 * auVar285._4_4_ + fVar315 * fVar209;
  fVar212 = fVar288 * auVar285._8_4_ + fVar316 * fVar214;
  fVar228 = fVar289 * auVar285._12_4_ + fVar318 * fVar210;
  fVar229 = fVar286 * auVar285._16_4_ + fVar327 * fVar192;
  fVar230 = fVar287 * auVar285._20_4_ + fVar328 * fVar209;
  fVar232 = fVar288 * auVar285._24_4_ + fVar329 * fVar214;
  fVar247 = auVar231._0_4_;
  fVar248 = auVar231._4_4_;
  fVar249 = auVar231._8_4_;
  fVar250 = auVar231._12_4_;
  fVar298 = fVar297 * fVar314 + auVar285._0_4_ * fVar247;
  fVar300 = fVar299 * fVar315 + auVar285._4_4_ * fVar248;
  fVar304 = fVar303 * fVar316 + auVar285._8_4_ * fVar249;
  fVar310 = fVar305 * fVar318 + auVar285._12_4_ * fVar250;
  fVar306 = fVar297 * fVar327 + auVar285._16_4_ * fVar247;
  fVar307 = fVar299 * fVar328 + auVar285._20_4_ * fVar248;
  fVar308 = fVar303 * fVar329 + auVar285._24_4_ * fVar249;
  fVar309 = fVar305 + fVar210;
  auVar220 = vshufps_avx(auVar165,auVar165,0xaa);
  auVar108 = vshufps_avx(auVar165,auVar165,0xff);
  fVar233 = fVar289 + 0.0;
  auVar141 = vshufps_avx(auVar138,auVar138,0xaa);
  auVar109 = vshufps_avx(auVar138,auVar138,0xff);
  auVar190._0_4_ =
       fVar314 * (auVar285._0_4_ * fVar192 + fVar314 * auVar155._0_4_) + auVar285._0_4_ * fVar211;
  auVar190._4_4_ =
       fVar315 * (auVar285._4_4_ * fVar209 + fVar315 * auVar155._4_4_) + auVar285._4_4_ * fVar251;
  auVar190._8_4_ =
       fVar316 * (auVar285._8_4_ * fVar214 + fVar316 * auVar155._8_4_) + auVar285._8_4_ * fVar212;
  auVar190._12_4_ =
       fVar318 * (auVar285._12_4_ * fVar210 + fVar318 * auVar155._12_4_) + auVar285._12_4_ * fVar228
  ;
  auVar190._16_4_ =
       fVar327 * (auVar285._16_4_ * fVar192 + fVar327 * auVar155._0_4_) + auVar285._16_4_ * fVar229;
  auVar190._20_4_ =
       fVar328 * (auVar285._20_4_ * fVar209 + fVar328 * auVar155._4_4_) + auVar285._20_4_ * fVar230;
  auVar190._24_4_ =
       fVar329 * (auVar285._24_4_ * fVar214 + fVar329 * auVar155._8_4_) + auVar285._24_4_ * fVar232;
  auVar190._28_4_ = auVar155._12_4_ + 1.0 + fVar250;
  auVar207._0_4_ =
       fVar314 * (fVar297 * auVar285._0_4_ + auVar120._0_4_ * fVar314) + auVar285._0_4_ * fVar298;
  auVar207._4_4_ =
       fVar315 * (fVar299 * auVar285._4_4_ + auVar120._4_4_ * fVar315) + auVar285._4_4_ * fVar300;
  auVar207._8_4_ =
       fVar316 * (fVar303 * auVar285._8_4_ + auVar120._8_4_ * fVar316) + auVar285._8_4_ * fVar304;
  auVar207._12_4_ =
       fVar318 * (fVar305 * auVar285._12_4_ + auVar120._12_4_ * fVar318) + auVar285._12_4_ * fVar310
  ;
  auVar207._16_4_ =
       fVar327 * (fVar297 * auVar285._16_4_ + auVar120._0_4_ * fVar327) + auVar285._16_4_ * fVar306;
  auVar207._20_4_ =
       fVar328 * (fVar299 * auVar285._20_4_ + auVar120._4_4_ * fVar328) + auVar285._20_4_ * fVar307;
  auVar207._24_4_ =
       fVar329 * (fVar303 * auVar285._24_4_ + auVar120._8_4_ * fVar329) + auVar285._24_4_ * fVar308;
  auVar207._28_4_ = auVar74._12_4_ + fVar250;
  auVar95._0_4_ =
       fVar314 * fVar211 + auVar285._0_4_ * (fVar286 * fVar314 + auVar9._0_4_ * auVar285._0_4_);
  auVar95._4_4_ =
       fVar315 * fVar251 + auVar285._4_4_ * (fVar287 * fVar315 + auVar9._4_4_ * auVar285._4_4_);
  auVar95._8_4_ =
       fVar316 * fVar212 + auVar285._8_4_ * (fVar288 * fVar316 + auVar9._8_4_ * auVar285._8_4_);
  auVar95._12_4_ =
       fVar318 * fVar228 + auVar285._12_4_ * (fVar289 * fVar318 + auVar9._12_4_ * auVar285._12_4_);
  auVar95._16_4_ =
       fVar327 * fVar229 + auVar285._16_4_ * (fVar286 * fVar327 + auVar9._0_4_ * auVar285._16_4_);
  auVar95._20_4_ =
       fVar328 * fVar230 + auVar285._20_4_ * (fVar287 * fVar328 + auVar9._4_4_ * auVar285._20_4_);
  auVar95._24_4_ =
       fVar329 * fVar232 + auVar285._24_4_ * (fVar288 * fVar329 + auVar9._8_4_ * auVar285._24_4_);
  auVar95._28_4_ = fVar210 + 1.0 + fVar233;
  auVar296._0_4_ =
       fVar314 * fVar298 + auVar285._0_4_ * (auVar74._0_4_ * auVar285._0_4_ + fVar314 * fVar247);
  auVar296._4_4_ =
       fVar315 * fVar300 + auVar285._4_4_ * (auVar74._4_4_ * auVar285._4_4_ + fVar315 * fVar248);
  auVar296._8_4_ =
       fVar316 * fVar304 + auVar285._8_4_ * (auVar74._8_4_ * auVar285._8_4_ + fVar316 * fVar249);
  auVar296._12_4_ =
       fVar318 * fVar310 + auVar285._12_4_ * (auVar74._12_4_ * auVar285._12_4_ + fVar318 * fVar250);
  auVar296._16_4_ =
       fVar327 * fVar306 + auVar285._16_4_ * (auVar74._0_4_ * auVar285._16_4_ + fVar327 * fVar247);
  auVar296._20_4_ =
       fVar328 * fVar307 + auVar285._20_4_ * (auVar74._4_4_ * auVar285._20_4_ + fVar328 * fVar248);
  auVar296._24_4_ =
       fVar329 * fVar308 + auVar285._24_4_ * (auVar74._8_4_ * auVar285._24_4_ + fVar329 * fVar249);
  auVar296._28_4_ = fVar233 + fVar250 + 0.0;
  local_220._0_4_ = fVar314 * auVar190._0_4_ + auVar285._0_4_ * auVar95._0_4_;
  local_220._4_4_ = fVar315 * auVar190._4_4_ + auVar285._4_4_ * auVar95._4_4_;
  local_220._8_4_ = fVar316 * auVar190._8_4_ + auVar285._8_4_ * auVar95._8_4_;
  local_220._12_4_ = fVar318 * auVar190._12_4_ + auVar285._12_4_ * auVar95._12_4_;
  local_220._16_4_ = fVar327 * auVar190._16_4_ + auVar285._16_4_ * auVar95._16_4_;
  local_220._20_4_ = fVar328 * auVar190._20_4_ + auVar285._20_4_ * auVar95._20_4_;
  local_220._24_4_ = fVar329 * auVar190._24_4_ + auVar285._24_4_ * auVar95._24_4_;
  local_220._28_4_ = fVar309 + fVar250 + 0.0;
  auVar173._0_4_ = fVar314 * auVar207._0_4_ + auVar285._0_4_ * auVar296._0_4_;
  auVar173._4_4_ = fVar315 * auVar207._4_4_ + auVar285._4_4_ * auVar296._4_4_;
  auVar173._8_4_ = fVar316 * auVar207._8_4_ + auVar285._8_4_ * auVar296._8_4_;
  auVar173._12_4_ = fVar318 * auVar207._12_4_ + auVar285._12_4_ * auVar296._12_4_;
  auVar173._16_4_ = fVar327 * auVar207._16_4_ + auVar285._16_4_ * auVar296._16_4_;
  auVar173._20_4_ = fVar328 * auVar207._20_4_ + auVar285._20_4_ * auVar296._20_4_;
  auVar173._24_4_ = fVar329 * auVar207._24_4_ + auVar285._24_4_ * auVar296._24_4_;
  auVar173._28_4_ = fVar309 + fVar233;
  auVar18 = vsubps_avx(auVar95,auVar190);
  auVar90 = vsubps_avx(auVar296,auVar207);
  local_660 = auVar79._0_4_;
  fStack_65c = auVar79._4_4_;
  fStack_658 = auVar79._8_4_;
  fStack_654 = auVar79._12_4_;
  local_260 = local_660 * auVar18._0_4_ * 3.0;
  fStack_25c = fStack_65c * auVar18._4_4_ * 3.0;
  auVar25._4_4_ = fStack_25c;
  auVar25._0_4_ = local_260;
  fStack_258 = fStack_658 * auVar18._8_4_ * 3.0;
  auVar25._8_4_ = fStack_258;
  fStack_254 = fStack_654 * auVar18._12_4_ * 3.0;
  auVar25._12_4_ = fStack_254;
  fStack_250 = local_660 * auVar18._16_4_ * 3.0;
  auVar25._16_4_ = fStack_250;
  fStack_24c = fStack_65c * auVar18._20_4_ * 3.0;
  auVar25._20_4_ = fStack_24c;
  fStack_248 = fStack_658 * auVar18._24_4_ * 3.0;
  auVar25._24_4_ = fStack_248;
  auVar25._28_4_ = auVar18._28_4_;
  local_280 = local_660 * auVar90._0_4_ * 3.0;
  fStack_27c = fStack_65c * auVar90._4_4_ * 3.0;
  auVar26._4_4_ = fStack_27c;
  auVar26._0_4_ = local_280;
  fStack_278 = fStack_658 * auVar90._8_4_ * 3.0;
  auVar26._8_4_ = fStack_278;
  fStack_274 = fStack_654 * auVar90._12_4_ * 3.0;
  auVar26._12_4_ = fStack_274;
  fStack_270 = local_660 * auVar90._16_4_ * 3.0;
  auVar26._16_4_ = fStack_270;
  fStack_26c = fStack_65c * auVar90._20_4_ * 3.0;
  auVar26._20_4_ = fStack_26c;
  fStack_268 = fStack_658 * auVar90._24_4_ * 3.0;
  auVar26._24_4_ = fStack_268;
  auVar26._28_4_ = fVar309;
  auVar15 = vsubps_avx(local_220,auVar25);
  auVar90 = vperm2f128_avx(auVar15,auVar15,1);
  auVar90 = vshufps_avx(auVar90,auVar15,0x30);
  auVar90 = vshufps_avx(auVar15,auVar90,0x29);
  auVar16 = vsubps_avx(auVar173,auVar26);
  auVar15 = vperm2f128_avx(auVar16,auVar16,1);
  auVar15 = vshufps_avx(auVar15,auVar16,0x30);
  auVar16 = vshufps_avx(auVar16,auVar15,0x29);
  fVar307 = auVar141._0_4_;
  fVar308 = auVar141._4_4_;
  fVar335 = auVar141._8_4_;
  fVar210 = auVar220._12_4_;
  fVar287 = auVar109._0_4_;
  fVar289 = auVar109._4_4_;
  fVar298 = auVar109._8_4_;
  fVar300 = auVar109._12_4_;
  auVar79 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar192 = auVar79._0_4_;
  fVar209 = auVar79._4_4_;
  fVar214 = auVar79._8_4_;
  fVar250 = auVar79._12_4_;
  fVar212 = auVar285._0_4_ * fVar192 + fVar307 * fVar314;
  fVar228 = auVar285._4_4_ * fVar209 + fVar308 * fVar315;
  fVar229 = auVar285._8_4_ * fVar214 + fVar335 * fVar316;
  fVar230 = auVar285._12_4_ * fVar250 + auVar141._12_4_ * fVar318;
  fVar232 = auVar285._16_4_ * fVar192 + fVar307 * fVar327;
  fVar233 = auVar285._20_4_ * fVar209 + fVar308 * fVar328;
  fVar286 = auVar285._24_4_ * fVar214 + fVar335 * fVar329;
  auVar79 = vshufps_avx(auVar240,auVar240,0xff);
  fVar247 = auVar79._0_4_;
  fVar248 = auVar79._4_4_;
  fVar249 = auVar79._8_4_;
  fVar211 = auVar79._12_4_;
  fVar288 = auVar285._0_4_ * fVar247 + fVar287 * fVar314;
  fVar297 = auVar285._4_4_ * fVar248 + fVar289 * fVar315;
  fVar299 = auVar285._8_4_ * fVar249 + fVar298 * fVar316;
  fVar303 = auVar285._12_4_ * fVar211 + fVar300 * fVar318;
  fVar304 = auVar285._16_4_ * fVar247 + fVar287 * fVar327;
  fVar305 = auVar285._20_4_ * fVar248 + fVar289 * fVar328;
  fVar310 = auVar285._24_4_ * fVar249 + fVar298 * fVar329;
  auVar79 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar306 = auVar79._12_4_ + fVar250;
  auVar155 = vshufps_avx(auVar177,auVar177,0xff);
  fVar251 = auVar155._12_4_;
  auVar96._0_4_ =
       fVar314 * (fVar307 * auVar285._0_4_ + fVar314 * auVar220._0_4_) + auVar285._0_4_ * fVar212;
  auVar96._4_4_ =
       fVar315 * (fVar308 * auVar285._4_4_ + fVar315 * auVar220._4_4_) + auVar285._4_4_ * fVar228;
  auVar96._8_4_ =
       fVar316 * (fVar335 * auVar285._8_4_ + fVar316 * auVar220._8_4_) + auVar285._8_4_ * fVar229;
  auVar96._12_4_ =
       fVar318 * (auVar141._12_4_ * auVar285._12_4_ + fVar318 * fVar210) + auVar285._12_4_ * fVar230
  ;
  auVar96._16_4_ =
       fVar327 * (fVar307 * auVar285._16_4_ + fVar327 * auVar220._0_4_) + auVar285._16_4_ * fVar232;
  auVar96._20_4_ =
       fVar328 * (fVar308 * auVar285._20_4_ + fVar328 * auVar220._4_4_) + auVar285._20_4_ * fVar233;
  auVar96._24_4_ =
       fVar329 * (fVar335 * auVar285._24_4_ + fVar329 * auVar220._8_4_) + auVar285._24_4_ * fVar286;
  auVar96._28_4_ = auVar16._28_4_ + fVar210 + fVar251;
  auVar129._0_4_ =
       fVar314 * (fVar287 * auVar285._0_4_ + auVar108._0_4_ * fVar314) + auVar285._0_4_ * fVar288;
  auVar129._4_4_ =
       fVar315 * (fVar289 * auVar285._4_4_ + auVar108._4_4_ * fVar315) + auVar285._4_4_ * fVar297;
  auVar129._8_4_ =
       fVar316 * (fVar298 * auVar285._8_4_ + auVar108._8_4_ * fVar316) + auVar285._8_4_ * fVar299;
  auVar129._12_4_ =
       fVar318 * (fVar300 * auVar285._12_4_ + auVar108._12_4_ * fVar318) + auVar285._12_4_ * fVar303
  ;
  auVar129._16_4_ =
       fVar327 * (fVar287 * auVar285._16_4_ + auVar108._0_4_ * fVar327) + auVar285._16_4_ * fVar304;
  auVar129._20_4_ =
       fVar328 * (fVar289 * auVar285._20_4_ + auVar108._4_4_ * fVar328) + auVar285._20_4_ * fVar305;
  auVar129._24_4_ =
       fVar329 * (fVar298 * auVar285._24_4_ + auVar108._8_4_ * fVar329) + auVar285._24_4_ * fVar310;
  auVar129._28_4_ = fVar210 + auVar15._28_4_ + fVar251;
  auVar15 = vperm2f128_avx(local_220,local_220,1);
  auVar15 = vshufps_avx(auVar15,local_220,0x30);
  _local_560 = vshufps_avx(local_220,auVar15,0x29);
  auVar208._0_4_ =
       auVar285._0_4_ * (auVar79._0_4_ * auVar285._0_4_ + fVar314 * fVar192) + fVar314 * fVar212;
  auVar208._4_4_ =
       auVar285._4_4_ * (auVar79._4_4_ * auVar285._4_4_ + fVar315 * fVar209) + fVar315 * fVar228;
  auVar208._8_4_ =
       auVar285._8_4_ * (auVar79._8_4_ * auVar285._8_4_ + fVar316 * fVar214) + fVar316 * fVar229;
  auVar208._12_4_ =
       auVar285._12_4_ * (auVar79._12_4_ * auVar285._12_4_ + fVar318 * fVar250) + fVar318 * fVar230;
  auVar208._16_4_ =
       auVar285._16_4_ * (auVar79._0_4_ * auVar285._16_4_ + fVar327 * fVar192) + fVar327 * fVar232;
  auVar208._20_4_ =
       auVar285._20_4_ * (auVar79._4_4_ * auVar285._20_4_ + fVar328 * fVar209) + fVar328 * fVar233;
  auVar208._24_4_ =
       auVar285._24_4_ * (auVar79._8_4_ * auVar285._24_4_ + fVar329 * fVar214) + fVar329 * fVar286;
  auVar208._28_4_ = fVar306 + fVar317 + auVar207._28_4_;
  auVar264._0_4_ =
       fVar314 * fVar288 + auVar285._0_4_ * (auVar285._0_4_ * auVar155._0_4_ + fVar314 * fVar247);
  auVar264._4_4_ =
       fVar315 * fVar297 + auVar285._4_4_ * (auVar285._4_4_ * auVar155._4_4_ + fVar315 * fVar248);
  auVar264._8_4_ =
       fVar316 * fVar299 + auVar285._8_4_ * (auVar285._8_4_ * auVar155._8_4_ + fVar316 * fVar249);
  auVar264._12_4_ =
       fVar318 * fVar303 + auVar285._12_4_ * (auVar285._12_4_ * fVar251 + fVar318 * fVar211);
  auVar264._16_4_ =
       fVar327 * fVar304 + auVar285._16_4_ * (auVar285._16_4_ * auVar155._0_4_ + fVar327 * fVar247);
  auVar264._20_4_ =
       fVar328 * fVar305 + auVar285._20_4_ * (auVar285._20_4_ * auVar155._4_4_ + fVar328 * fVar248);
  auVar264._24_4_ =
       fVar329 * fVar310 + auVar285._24_4_ * (auVar285._24_4_ * auVar155._8_4_ + fVar329 * fVar249);
  auVar264._28_4_ = fVar317 + fVar300 + fVar251 + fVar211;
  auVar246._0_4_ = fVar314 * auVar96._0_4_ + auVar285._0_4_ * auVar208._0_4_;
  auVar246._4_4_ = fVar315 * auVar96._4_4_ + auVar285._4_4_ * auVar208._4_4_;
  auVar246._8_4_ = fVar316 * auVar96._8_4_ + auVar285._8_4_ * auVar208._8_4_;
  auVar246._12_4_ = fVar318 * auVar96._12_4_ + auVar285._12_4_ * auVar208._12_4_;
  auVar246._16_4_ = fVar327 * auVar96._16_4_ + auVar285._16_4_ * auVar208._16_4_;
  auVar246._20_4_ = fVar328 * auVar96._20_4_ + auVar285._20_4_ * auVar208._20_4_;
  auVar246._24_4_ = fVar329 * auVar96._24_4_ + auVar285._24_4_ * auVar208._24_4_;
  auVar246._28_4_ = fVar306 + fVar251 + fVar211;
  auVar275._0_4_ = fVar314 * auVar129._0_4_ + auVar285._0_4_ * auVar264._0_4_;
  auVar275._4_4_ = fVar315 * auVar129._4_4_ + auVar285._4_4_ * auVar264._4_4_;
  auVar275._8_4_ = fVar316 * auVar129._8_4_ + auVar285._8_4_ * auVar264._8_4_;
  auVar275._12_4_ = fVar318 * auVar129._12_4_ + auVar285._12_4_ * auVar264._12_4_;
  auVar275._16_4_ = fVar327 * auVar129._16_4_ + auVar285._16_4_ * auVar264._16_4_;
  auVar275._20_4_ = fVar328 * auVar129._20_4_ + auVar285._20_4_ * auVar264._20_4_;
  auVar275._24_4_ = fVar329 * auVar129._24_4_ + auVar285._24_4_ * auVar264._24_4_;
  auVar275._28_4_ = auVar17._28_4_ + auVar285._28_4_;
  auVar21 = vsubps_avx(auVar208,auVar96);
  auVar15 = vsubps_avx(auVar264,auVar129);
  local_2a0 = local_660 * auVar21._0_4_ * 3.0;
  fStack_29c = fStack_65c * auVar21._4_4_ * 3.0;
  auVar27._4_4_ = fStack_29c;
  auVar27._0_4_ = local_2a0;
  fStack_298 = fStack_658 * auVar21._8_4_ * 3.0;
  auVar27._8_4_ = fStack_298;
  fStack_294 = fStack_654 * auVar21._12_4_ * 3.0;
  auVar27._12_4_ = fStack_294;
  fStack_290 = local_660 * auVar21._16_4_ * 3.0;
  auVar27._16_4_ = fStack_290;
  fStack_28c = fStack_65c * auVar21._20_4_ * 3.0;
  auVar27._20_4_ = fStack_28c;
  fStack_288 = fStack_658 * auVar21._24_4_ * 3.0;
  auVar27._24_4_ = fStack_288;
  auVar27._28_4_ = auVar21._28_4_;
  local_2c0 = local_660 * auVar15._0_4_ * 3.0;
  fStack_2bc = fStack_65c * auVar15._4_4_ * 3.0;
  auVar28._4_4_ = fStack_2bc;
  auVar28._0_4_ = local_2c0;
  fStack_2b8 = fStack_658 * auVar15._8_4_ * 3.0;
  auVar28._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_654 * auVar15._12_4_ * 3.0;
  auVar28._12_4_ = fStack_2b4;
  fStack_2b0 = local_660 * auVar15._16_4_ * 3.0;
  auVar28._16_4_ = fStack_2b0;
  fStack_2ac = fStack_65c * auVar15._20_4_ * 3.0;
  auVar28._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_658 * auVar15._24_4_ * 3.0;
  auVar28._24_4_ = fStack_2a8;
  auVar28._28_4_ = auVar208._28_4_;
  auVar15 = vperm2f128_avx(auVar246,auVar246,1);
  auVar15 = vshufps_avx(auVar15,auVar246,0x30);
  auVar19 = vshufps_avx(auVar246,auVar15,0x29);
  auVar17 = vsubps_avx(auVar246,auVar27);
  auVar15 = vperm2f128_avx(auVar17,auVar17,1);
  auVar15 = vshufps_avx(auVar15,auVar17,0x30);
  auVar15 = vshufps_avx(auVar17,auVar15,0x29);
  auVar20 = vsubps_avx(auVar275,auVar28);
  auVar17 = vperm2f128_avx(auVar20,auVar20,1);
  auVar17 = vshufps_avx(auVar17,auVar20,0x30);
  local_200 = vshufps_avx(auVar20,auVar17,0x29);
  auVar22 = vsubps_avx(auVar246,local_220);
  auVar23 = vsubps_avx(auVar19,_local_560);
  fVar192 = auVar23._0_4_ + auVar22._0_4_;
  fVar247 = auVar23._4_4_ + auVar22._4_4_;
  fVar209 = auVar23._8_4_ + auVar22._8_4_;
  fVar248 = auVar23._12_4_ + auVar22._12_4_;
  fVar214 = auVar23._16_4_ + auVar22._16_4_;
  fVar249 = auVar23._20_4_ + auVar22._20_4_;
  fVar210 = auVar23._24_4_ + auVar22._24_4_;
  auVar17 = vperm2f128_avx(auVar173,auVar173,1);
  auVar17 = vshufps_avx(auVar17,auVar173,0x30);
  local_240 = vshufps_avx(auVar173,auVar17,0x29);
  auVar17 = vperm2f128_avx(auVar275,auVar275,1);
  auVar17 = vshufps_avx(auVar17,auVar275,0x30);
  auVar20 = vshufps_avx(auVar275,auVar17,0x29);
  auVar17 = vsubps_avx(auVar275,auVar173);
  auVar24 = vsubps_avx(auVar20,local_240);
  fVar250 = auVar24._0_4_ + auVar17._0_4_;
  fVar211 = auVar24._4_4_ + auVar17._4_4_;
  fVar251 = auVar24._8_4_ + auVar17._8_4_;
  fVar212 = auVar24._12_4_ + auVar17._12_4_;
  fVar228 = auVar24._16_4_ + auVar17._16_4_;
  fVar229 = auVar24._20_4_ + auVar17._20_4_;
  fVar230 = auVar24._24_4_ + auVar17._24_4_;
  auVar29._4_4_ = fVar247 * auVar173._4_4_;
  auVar29._0_4_ = fVar192 * auVar173._0_4_;
  auVar29._8_4_ = fVar209 * auVar173._8_4_;
  auVar29._12_4_ = fVar248 * auVar173._12_4_;
  auVar29._16_4_ = fVar214 * auVar173._16_4_;
  auVar29._20_4_ = fVar249 * auVar173._20_4_;
  auVar29._24_4_ = fVar210 * auVar173._24_4_;
  auVar29._28_4_ = auVar17._28_4_;
  auVar30._4_4_ = fVar211 * local_220._4_4_;
  auVar30._0_4_ = fVar250 * local_220._0_4_;
  auVar30._8_4_ = fVar251 * local_220._8_4_;
  auVar30._12_4_ = fVar212 * local_220._12_4_;
  auVar30._16_4_ = fVar228 * local_220._16_4_;
  auVar30._20_4_ = fVar229 * local_220._20_4_;
  auVar30._24_4_ = fVar230 * local_220._24_4_;
  auVar30._28_4_ = fVar306;
  auVar91 = vsubps_avx(auVar29,auVar30);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar18._28_4_;
  local_280 = local_280 + auVar173._0_4_;
  fStack_27c = fStack_27c + auVar173._4_4_;
  fStack_278 = fStack_278 + auVar173._8_4_;
  fStack_274 = fStack_274 + auVar173._12_4_;
  fStack_270 = fStack_270 + auVar173._16_4_;
  fStack_26c = fStack_26c + auVar173._20_4_;
  fStack_268 = fStack_268 + auVar173._24_4_;
  fStack_264 = fVar309 + auVar173._28_4_;
  auVar31._4_4_ = fVar247 * fStack_27c;
  auVar31._0_4_ = fVar192 * local_280;
  auVar31._8_4_ = fVar209 * fStack_278;
  auVar31._12_4_ = fVar248 * fStack_274;
  auVar31._16_4_ = fVar214 * fStack_270;
  auVar31._20_4_ = fVar249 * fStack_26c;
  auVar31._24_4_ = fVar210 * fStack_268;
  auVar31._28_4_ = fVar309;
  auVar32._4_4_ = fVar211 * fStack_25c;
  auVar32._0_4_ = fVar250 * local_260;
  auVar32._8_4_ = fVar251 * fStack_258;
  auVar32._12_4_ = fVar212 * fStack_254;
  auVar32._16_4_ = fVar228 * fStack_250;
  auVar32._20_4_ = fVar229 * fStack_24c;
  auVar32._24_4_ = fVar230 * fStack_248;
  auVar32._28_4_ = fVar309 + auVar173._28_4_;
  auVar18 = vsubps_avx(auVar31,auVar32);
  local_6c0._0_4_ = auVar16._0_4_;
  local_6c0._4_4_ = auVar16._4_4_;
  fStack_6b8 = auVar16._8_4_;
  fStack_6b4 = auVar16._12_4_;
  fStack_6b0 = auVar16._16_4_;
  fStack_6ac = auVar16._20_4_;
  fStack_6a8 = auVar16._24_4_;
  auVar33._4_4_ = fVar247 * (float)local_6c0._4_4_;
  auVar33._0_4_ = fVar192 * (float)local_6c0._0_4_;
  auVar33._8_4_ = fVar209 * fStack_6b8;
  auVar33._12_4_ = fVar248 * fStack_6b4;
  auVar33._16_4_ = fVar214 * fStack_6b0;
  auVar33._20_4_ = fVar249 * fStack_6ac;
  auVar33._24_4_ = fVar210 * fStack_6a8;
  auVar33._28_4_ = fVar309;
  local_700._0_4_ = auVar90._0_4_;
  local_700._4_4_ = auVar90._4_4_;
  fStack_6f8 = auVar90._8_4_;
  fStack_6f4 = auVar90._12_4_;
  fStack_6f0 = auVar90._16_4_;
  fStack_6ec = auVar90._20_4_;
  fStack_6e8 = auVar90._24_4_;
  auVar34._4_4_ = fVar211 * (float)local_700._4_4_;
  auVar34._0_4_ = fVar250 * (float)local_700._0_4_;
  auVar34._8_4_ = fVar251 * fStack_6f8;
  auVar34._12_4_ = fVar212 * fStack_6f4;
  auVar34._16_4_ = fVar228 * fStack_6f0;
  auVar34._20_4_ = fVar229 * fStack_6ec;
  auVar34._24_4_ = fVar230 * fStack_6e8;
  auVar34._28_4_ = local_220._28_4_;
  auVar92 = vsubps_avx(auVar33,auVar34);
  auVar35._4_4_ = local_240._4_4_ * fVar247;
  auVar35._0_4_ = local_240._0_4_ * fVar192;
  auVar35._8_4_ = local_240._8_4_ * fVar209;
  auVar35._12_4_ = local_240._12_4_ * fVar248;
  auVar35._16_4_ = local_240._16_4_ * fVar214;
  auVar35._20_4_ = local_240._20_4_ * fVar249;
  auVar35._24_4_ = local_240._24_4_ * fVar210;
  auVar35._28_4_ = fVar309;
  auVar36._4_4_ = local_560._4_4_ * fVar211;
  auVar36._0_4_ = local_560._0_4_ * fVar250;
  auVar36._8_4_ = local_560._8_4_ * fVar251;
  auVar36._12_4_ = local_560._12_4_ * fVar212;
  auVar36._16_4_ = local_560._16_4_ * fVar228;
  auVar36._20_4_ = local_560._20_4_ * fVar229;
  auVar36._24_4_ = local_560._24_4_ * fVar230;
  auVar36._28_4_ = local_240._28_4_;
  local_660 = auVar15._0_4_;
  fStack_65c = auVar15._4_4_;
  fStack_658 = auVar15._8_4_;
  fStack_654 = auVar15._12_4_;
  fStack_650 = auVar15._16_4_;
  fStack_64c = auVar15._20_4_;
  fStack_648 = auVar15._24_4_;
  auVar93 = vsubps_avx(auVar35,auVar36);
  auVar37._4_4_ = auVar275._4_4_ * fVar247;
  auVar37._0_4_ = auVar275._0_4_ * fVar192;
  auVar37._8_4_ = auVar275._8_4_ * fVar209;
  auVar37._12_4_ = auVar275._12_4_ * fVar248;
  auVar37._16_4_ = auVar275._16_4_ * fVar214;
  auVar37._20_4_ = auVar275._20_4_ * fVar249;
  auVar37._24_4_ = auVar275._24_4_ * fVar210;
  auVar37._28_4_ = fVar309;
  auVar38._4_4_ = fVar211 * auVar246._4_4_;
  auVar38._0_4_ = fVar250 * auVar246._0_4_;
  auVar38._8_4_ = fVar251 * auVar246._8_4_;
  auVar38._12_4_ = fVar212 * auVar246._12_4_;
  auVar38._16_4_ = fVar228 * auVar246._16_4_;
  auVar38._20_4_ = fVar229 * auVar246._20_4_;
  auVar38._24_4_ = fVar230 * auVar246._24_4_;
  auVar38._28_4_ = fStack_244;
  auVar125 = vsubps_avx(auVar37,auVar38);
  local_2a0 = auVar246._0_4_ + local_2a0;
  fStack_29c = auVar246._4_4_ + fStack_29c;
  fStack_298 = auVar246._8_4_ + fStack_298;
  fStack_294 = auVar246._12_4_ + fStack_294;
  fStack_290 = auVar246._16_4_ + fStack_290;
  fStack_28c = auVar246._20_4_ + fStack_28c;
  fStack_288 = auVar246._24_4_ + fStack_288;
  fStack_284 = auVar246._28_4_ + auVar21._28_4_;
  local_2c0 = auVar275._0_4_ + local_2c0;
  fStack_2bc = auVar275._4_4_ + fStack_2bc;
  fStack_2b8 = auVar275._8_4_ + fStack_2b8;
  fStack_2b4 = auVar275._12_4_ + fStack_2b4;
  fStack_2b0 = auVar275._16_4_ + fStack_2b0;
  fStack_2ac = auVar275._20_4_ + fStack_2ac;
  fStack_2a8 = auVar275._24_4_ + fStack_2a8;
  fStack_2a4 = auVar275._28_4_ + auVar208._28_4_;
  auVar39._4_4_ = fVar247 * fStack_2bc;
  auVar39._0_4_ = fVar192 * local_2c0;
  auVar39._8_4_ = fVar209 * fStack_2b8;
  auVar39._12_4_ = fVar248 * fStack_2b4;
  auVar39._16_4_ = fVar214 * fStack_2b0;
  auVar39._20_4_ = fVar249 * fStack_2ac;
  auVar39._24_4_ = fVar210 * fStack_2a8;
  auVar39._28_4_ = auVar275._28_4_ + auVar208._28_4_;
  auVar40._4_4_ = fStack_29c * fVar211;
  auVar40._0_4_ = local_2a0 * fVar250;
  auVar40._8_4_ = fStack_298 * fVar251;
  auVar40._12_4_ = fStack_294 * fVar212;
  auVar40._16_4_ = fStack_290 * fVar228;
  auVar40._20_4_ = fStack_28c * fVar229;
  auVar40._24_4_ = fStack_288 * fVar230;
  auVar40._28_4_ = fStack_284;
  auVar21 = vsubps_avx(auVar39,auVar40);
  auVar41._4_4_ = fVar247 * local_200._4_4_;
  auVar41._0_4_ = fVar192 * local_200._0_4_;
  auVar41._8_4_ = fVar209 * local_200._8_4_;
  auVar41._12_4_ = fVar248 * local_200._12_4_;
  auVar41._16_4_ = fVar214 * local_200._16_4_;
  auVar41._20_4_ = fVar249 * local_200._20_4_;
  auVar41._24_4_ = fVar210 * local_200._24_4_;
  auVar41._28_4_ = fStack_284;
  auVar42._4_4_ = fVar211 * fStack_65c;
  auVar42._0_4_ = fVar250 * local_660;
  auVar42._8_4_ = fVar251 * fStack_658;
  auVar42._12_4_ = fVar212 * fStack_654;
  auVar42._16_4_ = fVar228 * fStack_650;
  auVar42._20_4_ = fVar229 * fStack_64c;
  auVar42._24_4_ = fVar230 * fStack_648;
  auVar42._28_4_ = local_200._28_4_;
  auVar126 = vsubps_avx(auVar41,auVar42);
  auVar43._4_4_ = fVar247 * auVar20._4_4_;
  auVar43._0_4_ = fVar192 * auVar20._0_4_;
  auVar43._8_4_ = fVar209 * auVar20._8_4_;
  auVar43._12_4_ = fVar248 * auVar20._12_4_;
  auVar43._16_4_ = fVar214 * auVar20._16_4_;
  auVar43._20_4_ = fVar249 * auVar20._20_4_;
  auVar43._24_4_ = fVar210 * auVar20._24_4_;
  auVar43._28_4_ = auVar23._28_4_ + auVar22._28_4_;
  auVar44._4_4_ = auVar19._4_4_ * fVar211;
  auVar44._0_4_ = auVar19._0_4_ * fVar250;
  auVar44._8_4_ = auVar19._8_4_ * fVar251;
  auVar44._12_4_ = auVar19._12_4_ * fVar212;
  auVar44._16_4_ = auVar19._16_4_ * fVar228;
  auVar44._20_4_ = auVar19._20_4_ * fVar229;
  auVar44._24_4_ = auVar19._24_4_ * fVar230;
  auVar44._28_4_ = auVar24._28_4_ + auVar17._28_4_;
  auVar22 = vsubps_avx(auVar43,auVar44);
  auVar15 = vminps_avx(auVar91,auVar18);
  auVar90 = vmaxps_avx(auVar91,auVar18);
  auVar16 = vminps_avx(auVar92,auVar93);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar92,auVar93);
  auVar90 = vmaxps_avx(auVar90,auVar15);
  auVar17 = vminps_avx(auVar125,auVar21);
  auVar15 = vmaxps_avx(auVar125,auVar21);
  auVar18 = vminps_avx(auVar126,auVar22);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar18 = vminps_avx(auVar16,auVar18);
  auVar16 = vmaxps_avx(auVar126,auVar22);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar90,auVar15);
  auVar90 = vcmpps_avx(auVar18,local_1c0,2);
  auVar15 = vcmpps_avx(auVar15,local_1e0,5);
  auVar90 = vandps_avx(auVar15,auVar90);
  auVar15 = local_2e0 & auVar90;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(_local_560,local_220);
    auVar16 = vsubps_avx(auVar19,auVar246);
    fVar247 = auVar15._0_4_ + auVar16._0_4_;
    fVar209 = auVar15._4_4_ + auVar16._4_4_;
    fVar248 = auVar15._8_4_ + auVar16._8_4_;
    fVar214 = auVar15._12_4_ + auVar16._12_4_;
    fVar249 = auVar15._16_4_ + auVar16._16_4_;
    fVar210 = auVar15._20_4_ + auVar16._20_4_;
    fVar250 = auVar15._24_4_ + auVar16._24_4_;
    auVar18 = vsubps_avx(local_240,auVar173);
    auVar21 = vsubps_avx(auVar20,auVar275);
    fVar211 = auVar18._0_4_ + auVar21._0_4_;
    fVar251 = auVar18._4_4_ + auVar21._4_4_;
    fVar212 = auVar18._8_4_ + auVar21._8_4_;
    fVar228 = auVar18._12_4_ + auVar21._12_4_;
    fVar229 = auVar18._16_4_ + auVar21._16_4_;
    fVar230 = auVar18._20_4_ + auVar21._20_4_;
    fVar232 = auVar18._24_4_ + auVar21._24_4_;
    fVar192 = auVar21._28_4_;
    auVar45._4_4_ = auVar173._4_4_ * fVar209;
    auVar45._0_4_ = auVar173._0_4_ * fVar247;
    auVar45._8_4_ = auVar173._8_4_ * fVar248;
    auVar45._12_4_ = auVar173._12_4_ * fVar214;
    auVar45._16_4_ = auVar173._16_4_ * fVar249;
    auVar45._20_4_ = auVar173._20_4_ * fVar210;
    auVar45._24_4_ = auVar173._24_4_ * fVar250;
    auVar45._28_4_ = auVar173._28_4_;
    auVar46._4_4_ = local_220._4_4_ * fVar251;
    auVar46._0_4_ = local_220._0_4_ * fVar211;
    auVar46._8_4_ = local_220._8_4_ * fVar212;
    auVar46._12_4_ = local_220._12_4_ * fVar228;
    auVar46._16_4_ = local_220._16_4_ * fVar229;
    auVar46._20_4_ = local_220._20_4_ * fVar230;
    auVar46._24_4_ = local_220._24_4_ * fVar232;
    auVar46._28_4_ = local_220._28_4_;
    auVar21 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar209 * fStack_27c;
    auVar47._0_4_ = fVar247 * local_280;
    auVar47._8_4_ = fVar248 * fStack_278;
    auVar47._12_4_ = fVar214 * fStack_274;
    auVar47._16_4_ = fVar249 * fStack_270;
    auVar47._20_4_ = fVar210 * fStack_26c;
    auVar47._24_4_ = fVar250 * fStack_268;
    auVar47._28_4_ = auVar173._28_4_;
    auVar48._4_4_ = fVar251 * fStack_25c;
    auVar48._0_4_ = fVar211 * local_260;
    auVar48._8_4_ = fVar212 * fStack_258;
    auVar48._12_4_ = fVar228 * fStack_254;
    auVar48._16_4_ = fVar229 * fStack_250;
    auVar48._20_4_ = fVar230 * fStack_24c;
    auVar48._24_4_ = fVar232 * fStack_248;
    auVar48._28_4_ = fVar192;
    auVar22 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar209 * (float)local_6c0._4_4_;
    auVar49._0_4_ = fVar247 * (float)local_6c0._0_4_;
    auVar49._8_4_ = fVar248 * fStack_6b8;
    auVar49._12_4_ = fVar214 * fStack_6b4;
    auVar49._16_4_ = fVar249 * fStack_6b0;
    auVar49._20_4_ = fVar210 * fStack_6ac;
    auVar49._24_4_ = fVar250 * fStack_6a8;
    auVar49._28_4_ = fVar192;
    auVar50._4_4_ = fVar251 * (float)local_700._4_4_;
    auVar50._0_4_ = fVar211 * (float)local_700._0_4_;
    auVar50._8_4_ = fVar212 * fStack_6f8;
    auVar50._12_4_ = fVar228 * fStack_6f4;
    auVar50._16_4_ = fVar229 * fStack_6f0;
    auVar50._20_4_ = fVar230 * fStack_6ec;
    auVar50._24_4_ = fVar232 * fStack_6e8;
    auVar50._28_4_ = auVar17._28_4_;
    auVar23 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = local_240._4_4_ * fVar209;
    auVar51._0_4_ = local_240._0_4_ * fVar247;
    auVar51._8_4_ = local_240._8_4_ * fVar248;
    auVar51._12_4_ = local_240._12_4_ * fVar214;
    auVar51._16_4_ = local_240._16_4_ * fVar249;
    auVar51._20_4_ = local_240._20_4_ * fVar210;
    auVar51._24_4_ = local_240._24_4_ * fVar250;
    auVar51._28_4_ = auVar17._28_4_;
    auVar52._4_4_ = local_560._4_4_ * fVar251;
    auVar52._0_4_ = local_560._0_4_ * fVar211;
    auVar52._8_4_ = local_560._8_4_ * fVar212;
    auVar52._12_4_ = local_560._12_4_ * fVar228;
    auVar52._16_4_ = local_560._16_4_ * fVar229;
    auVar52._20_4_ = local_560._20_4_ * fVar230;
    uVar73 = local_560._28_4_;
    auVar52._24_4_ = local_560._24_4_ * fVar232;
    auVar52._28_4_ = uVar73;
    auVar24 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = auVar275._4_4_ * fVar209;
    auVar53._0_4_ = auVar275._0_4_ * fVar247;
    auVar53._8_4_ = auVar275._8_4_ * fVar248;
    auVar53._12_4_ = auVar275._12_4_ * fVar214;
    auVar53._16_4_ = auVar275._16_4_ * fVar249;
    auVar53._20_4_ = auVar275._20_4_ * fVar210;
    auVar53._24_4_ = auVar275._24_4_ * fVar250;
    auVar53._28_4_ = uVar73;
    auVar54._4_4_ = auVar246._4_4_ * fVar251;
    auVar54._0_4_ = auVar246._0_4_ * fVar211;
    auVar54._8_4_ = auVar246._8_4_ * fVar212;
    auVar54._12_4_ = auVar246._12_4_ * fVar228;
    auVar54._16_4_ = auVar246._16_4_ * fVar229;
    auVar54._20_4_ = auVar246._20_4_ * fVar230;
    auVar54._24_4_ = auVar246._24_4_ * fVar232;
    auVar54._28_4_ = auVar246._28_4_;
    auVar91 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = fVar209 * fStack_2bc;
    auVar55._0_4_ = fVar247 * local_2c0;
    auVar55._8_4_ = fVar248 * fStack_2b8;
    auVar55._12_4_ = fVar214 * fStack_2b4;
    auVar55._16_4_ = fVar249 * fStack_2b0;
    auVar55._20_4_ = fVar210 * fStack_2ac;
    auVar55._24_4_ = fVar250 * fStack_2a8;
    auVar55._28_4_ = uVar73;
    auVar56._4_4_ = fVar251 * fStack_29c;
    auVar56._0_4_ = fVar211 * local_2a0;
    auVar56._8_4_ = fVar212 * fStack_298;
    auVar56._12_4_ = fVar228 * fStack_294;
    auVar56._16_4_ = fVar229 * fStack_290;
    auVar56._20_4_ = fVar230 * fStack_28c;
    auVar56._24_4_ = fVar232 * fStack_288;
    auVar56._28_4_ = auVar275._28_4_;
    auVar92 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = fVar209 * local_200._4_4_;
    auVar57._0_4_ = fVar247 * local_200._0_4_;
    auVar57._8_4_ = fVar248 * local_200._8_4_;
    auVar57._12_4_ = fVar214 * local_200._12_4_;
    auVar57._16_4_ = fVar249 * local_200._16_4_;
    auVar57._20_4_ = fVar210 * local_200._20_4_;
    auVar57._24_4_ = fVar250 * local_200._24_4_;
    auVar57._28_4_ = auVar275._28_4_;
    auVar58._4_4_ = fStack_65c * fVar251;
    auVar58._0_4_ = local_660 * fVar211;
    auVar58._8_4_ = fStack_658 * fVar212;
    auVar58._12_4_ = fStack_654 * fVar228;
    auVar58._16_4_ = fStack_650 * fVar229;
    auVar58._20_4_ = fStack_64c * fVar230;
    auVar58._24_4_ = fStack_648 * fVar232;
    auVar58._28_4_ = local_240._28_4_;
    auVar93 = vsubps_avx(auVar57,auVar58);
    auVar59._4_4_ = fVar209 * auVar20._4_4_;
    auVar59._0_4_ = fVar247 * auVar20._0_4_;
    auVar59._8_4_ = fVar248 * auVar20._8_4_;
    auVar59._12_4_ = fVar214 * auVar20._12_4_;
    auVar59._16_4_ = fVar249 * auVar20._16_4_;
    auVar59._20_4_ = fVar210 * auVar20._20_4_;
    auVar59._24_4_ = fVar250 * auVar20._24_4_;
    auVar59._28_4_ = auVar15._28_4_ + auVar16._28_4_;
    auVar60._4_4_ = auVar19._4_4_ * fVar251;
    auVar60._0_4_ = auVar19._0_4_ * fVar211;
    auVar60._8_4_ = auVar19._8_4_ * fVar212;
    auVar60._12_4_ = auVar19._12_4_ * fVar228;
    auVar60._16_4_ = auVar19._16_4_ * fVar229;
    auVar60._20_4_ = auVar19._20_4_ * fVar230;
    auVar60._24_4_ = auVar19._24_4_ * fVar232;
    auVar60._28_4_ = auVar18._28_4_ + fVar192;
    auVar20 = vsubps_avx(auVar59,auVar60);
    auVar16 = vminps_avx(auVar21,auVar22);
    auVar15 = vmaxps_avx(auVar21,auVar22);
    auVar17 = vminps_avx(auVar23,auVar24);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar23,auVar24);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar18 = vminps_avx(auVar91,auVar92);
    auVar16 = vmaxps_avx(auVar91,auVar92);
    auVar19 = vminps_avx(auVar93,auVar20);
    auVar18 = vminps_avx(auVar18,auVar19);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar93,auVar20);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vcmpps_avx(auVar18,local_1c0,2);
    auVar16 = vcmpps_avx(auVar16,local_1e0,5);
    auVar15 = vandps_avx(auVar16,auVar15);
    auVar90 = vandps_avx(local_2e0,auVar90);
    auVar16 = auVar90 & auVar15;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar90 = vandps_avx(auVar15,auVar90);
      uVar66 = vmovmskps_avx(auVar90);
      if (uVar66 != 0) {
        auStack_4d0[uVar72] = uVar66 & 0xff;
        uVar4 = vmovlps_avx(local_440);
        *(undefined8 *)(afStack_360 + uVar72 * 2) = uVar4;
        uVar5 = vmovlps_avx(auVar101);
        auStack_1a0[uVar72] = uVar5;
        uVar72 = (ulong)((int)uVar72 + 1);
      }
    }
  }
LAB_009fb5e0:
  do {
    do {
      do {
        do {
          if ((int)uVar72 == 0) {
            if (bVar63) goto LAB_009fc677;
            uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar100._4_4_ = uVar73;
            auVar100._0_4_ = uVar73;
            auVar100._8_4_ = uVar73;
            auVar100._12_4_ = uVar73;
            auVar100._16_4_ = uVar73;
            auVar100._20_4_ = uVar73;
            auVar100._24_4_ = uVar73;
            auVar100._28_4_ = uVar73;
            auVar90 = vcmpps_avx(local_300,auVar100,2);
            uVar67 = vmovmskps_avx(auVar90);
            uVar68 = (ulong)((uint)uVar68 & (uint)uVar68 + 0xff & uVar67);
            goto LAB_009fa78e;
          }
          uVar70 = (int)uVar72 - 1;
          uVar71 = (ulong)uVar70;
          uVar66 = auStack_4d0[uVar71];
          fVar192 = afStack_360[uVar71 * 2];
          fVar247 = afStack_360[uVar71 * 2 + 1];
          auVar321._8_8_ = 0;
          auVar321._0_8_ = auStack_1a0[uVar71];
          auVar326 = ZEXT1664(auVar321);
          uVar5 = 0;
          if (uVar66 != 0) {
            for (; (uVar66 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar66 = uVar66 - 1 & uVar66;
          auStack_4d0[uVar71] = uVar66;
          if (uVar66 == 0) {
            uVar72 = (ulong)uVar70;
          }
          fVar248 = (float)(uVar5 + 1) * 0.14285715;
          fVar209 = (1.0 - (float)uVar5 * 0.14285715) * fVar192 +
                    fVar247 * (float)uVar5 * 0.14285715;
          fVar192 = (1.0 - fVar248) * fVar192 + fVar247 * fVar248;
          fVar247 = fVar192 - fVar209;
          if (0.16666667 <= fVar247) {
            auVar79 = vinsertps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar192),0x10);
            auVar334 = ZEXT1664(auVar79);
            goto LAB_009faf7a;
          }
          auVar79 = vshufps_avx(auVar321,auVar321,0x50);
          auVar106._8_4_ = 0x3f800000;
          auVar106._0_8_ = 0x3f8000003f800000;
          auVar106._12_4_ = 0x3f800000;
          auVar220 = vsubps_avx(auVar106,auVar79);
          fVar248 = auVar79._0_4_;
          fVar214 = auVar79._4_4_;
          fVar249 = auVar79._8_4_;
          fVar210 = auVar79._12_4_;
          fVar250 = auVar220._0_4_;
          fVar211 = auVar220._4_4_;
          fVar251 = auVar220._8_4_;
          fVar212 = auVar220._12_4_;
          auVar139._0_4_ = auVar278._0_4_ * fVar248 + fVar250 * fVar252;
          auVar139._4_4_ = auVar278._4_4_ * fVar214 + fVar211 * fVar215;
          auVar139._8_4_ = auVar278._0_4_ * fVar249 + fVar251 * fVar252;
          auVar139._12_4_ = auVar278._4_4_ * fVar210 + fVar212 * fVar215;
          auVar178._0_4_ = auVar258._0_4_ * fVar248 + fVar250 * fVar213;
          auVar178._4_4_ = auVar258._4_4_ * fVar214 + fVar211 * fVar227;
          auVar178._8_4_ = auVar258._0_4_ * fVar249 + fVar251 * fVar213;
          auVar178._12_4_ = auVar258._4_4_ * fVar210 + fVar212 * fVar227;
          auVar199._0_4_ = auVar269._0_4_ * fVar248 + auVar319._0_4_ * fVar250;
          auVar199._4_4_ = auVar269._4_4_ * fVar214 + auVar319._4_4_ * fVar211;
          auVar199._8_4_ = auVar269._0_4_ * fVar249 + auVar319._0_4_ * fVar251;
          auVar199._12_4_ = auVar269._4_4_ * fVar210 + auVar319._4_4_ * fVar212;
          auVar76._0_4_ = auVar105._0_4_ * fVar248 + auVar311._0_4_ * fVar250;
          auVar76._4_4_ = auVar105._4_4_ * fVar214 + auVar311._4_4_ * fVar211;
          auVar76._8_4_ = auVar105._0_4_ * fVar249 + auVar311._0_4_ * fVar251;
          auVar76._12_4_ = auVar105._4_4_ * fVar210 + auVar311._4_4_ * fVar212;
          auVar130._16_16_ = auVar139;
          auVar130._0_16_ = auVar139;
          auVar160._16_16_ = auVar178;
          auVar160._0_16_ = auVar178;
          auVar191._16_16_ = auVar199;
          auVar191._0_16_ = auVar199;
          auVar90 = ZEXT2032(CONCAT416(fVar192,ZEXT416((uint)fVar209)));
          auVar90 = vshufps_avx(auVar90,auVar90,0);
          auVar15 = vsubps_avx(auVar160,auVar130);
          fVar248 = auVar90._0_4_;
          fVar214 = auVar90._4_4_;
          fVar249 = auVar90._8_4_;
          fVar210 = auVar90._12_4_;
          fVar250 = auVar90._16_4_;
          fVar211 = auVar90._20_4_;
          fVar251 = auVar90._24_4_;
          auVar131._0_4_ = auVar139._0_4_ + auVar15._0_4_ * fVar248;
          auVar131._4_4_ = auVar139._4_4_ + auVar15._4_4_ * fVar214;
          auVar131._8_4_ = auVar139._8_4_ + auVar15._8_4_ * fVar249;
          auVar131._12_4_ = auVar139._12_4_ + auVar15._12_4_ * fVar210;
          auVar131._16_4_ = auVar139._0_4_ + auVar15._16_4_ * fVar250;
          auVar131._20_4_ = auVar139._4_4_ + auVar15._20_4_ * fVar211;
          auVar131._24_4_ = auVar139._8_4_ + auVar15._24_4_ * fVar251;
          auVar131._28_4_ = auVar139._12_4_ + auVar15._28_4_;
          auVar90 = vsubps_avx(auVar191,auVar160);
          auVar161._0_4_ = auVar178._0_4_ + auVar90._0_4_ * fVar248;
          auVar161._4_4_ = auVar178._4_4_ + auVar90._4_4_ * fVar214;
          auVar161._8_4_ = auVar178._8_4_ + auVar90._8_4_ * fVar249;
          auVar161._12_4_ = auVar178._12_4_ + auVar90._12_4_ * fVar210;
          auVar161._16_4_ = auVar178._0_4_ + auVar90._16_4_ * fVar250;
          auVar161._20_4_ = auVar178._4_4_ + auVar90._20_4_ * fVar211;
          auVar161._24_4_ = auVar178._8_4_ + auVar90._24_4_ * fVar251;
          auVar161._28_4_ = auVar178._12_4_ + auVar90._28_4_;
          auVar79 = vsubps_avx(auVar76,auVar199);
          auVar97._0_4_ = auVar199._0_4_ + auVar79._0_4_ * fVar248;
          auVar97._4_4_ = auVar199._4_4_ + auVar79._4_4_ * fVar214;
          auVar97._8_4_ = auVar199._8_4_ + auVar79._8_4_ * fVar249;
          auVar97._12_4_ = auVar199._12_4_ + auVar79._12_4_ * fVar210;
          auVar97._16_4_ = auVar199._0_4_ + auVar79._0_4_ * fVar250;
          auVar97._20_4_ = auVar199._4_4_ + auVar79._4_4_ * fVar211;
          auVar97._24_4_ = auVar199._8_4_ + auVar79._8_4_ * fVar251;
          auVar97._28_4_ = auVar199._12_4_ + auVar79._12_4_;
          auVar90 = vsubps_avx(auVar161,auVar131);
          auVar132._0_4_ = auVar131._0_4_ + fVar248 * auVar90._0_4_;
          auVar132._4_4_ = auVar131._4_4_ + fVar214 * auVar90._4_4_;
          auVar132._8_4_ = auVar131._8_4_ + fVar249 * auVar90._8_4_;
          auVar132._12_4_ = auVar131._12_4_ + fVar210 * auVar90._12_4_;
          auVar132._16_4_ = auVar131._16_4_ + fVar250 * auVar90._16_4_;
          auVar132._20_4_ = auVar131._20_4_ + fVar211 * auVar90._20_4_;
          auVar132._24_4_ = auVar131._24_4_ + fVar251 * auVar90._24_4_;
          auVar132._28_4_ = auVar131._28_4_ + auVar90._28_4_;
          auVar90 = vsubps_avx(auVar97,auVar161);
          auVar98._0_4_ = auVar161._0_4_ + fVar248 * auVar90._0_4_;
          auVar98._4_4_ = auVar161._4_4_ + fVar214 * auVar90._4_4_;
          auVar98._8_4_ = auVar161._8_4_ + fVar249 * auVar90._8_4_;
          auVar98._12_4_ = auVar161._12_4_ + fVar210 * auVar90._12_4_;
          auVar98._16_4_ = auVar161._16_4_ + fVar250 * auVar90._16_4_;
          auVar98._20_4_ = auVar161._20_4_ + fVar211 * auVar90._20_4_;
          auVar98._24_4_ = auVar161._24_4_ + fVar251 * auVar90._24_4_;
          auVar98._28_4_ = auVar161._28_4_ + auVar90._28_4_;
          auVar90 = vsubps_avx(auVar98,auVar132);
          auVar223._0_4_ = auVar132._0_4_ + fVar248 * auVar90._0_4_;
          auVar223._4_4_ = auVar132._4_4_ + fVar214 * auVar90._4_4_;
          auVar223._8_4_ = auVar132._8_4_ + fVar249 * auVar90._8_4_;
          auVar223._12_4_ = auVar132._12_4_ + fVar210 * auVar90._12_4_;
          auVar226._16_4_ = auVar132._16_4_ + fVar250 * auVar90._16_4_;
          auVar226._0_16_ = auVar223;
          auVar226._20_4_ = auVar132._20_4_ + fVar211 * auVar90._20_4_;
          auVar226._24_4_ = auVar132._24_4_ + fVar251 * auVar90._24_4_;
          auVar226._28_4_ = auVar132._28_4_ + auVar161._28_4_;
          auVar231 = auVar226._16_16_;
          auVar108 = vshufps_avx(ZEXT416((uint)(fVar247 * 0.33333334)),
                                 ZEXT416((uint)(fVar247 * 0.33333334)),0);
          auVar179._0_4_ = auVar223._0_4_ + auVar108._0_4_ * auVar90._0_4_ * 3.0;
          auVar179._4_4_ = auVar223._4_4_ + auVar108._4_4_ * auVar90._4_4_ * 3.0;
          auVar179._8_4_ = auVar223._8_4_ + auVar108._8_4_ * auVar90._8_4_ * 3.0;
          auVar179._12_4_ = auVar223._12_4_ + auVar108._12_4_ * auVar90._12_4_ * 3.0;
          auVar155 = vshufpd_avx(auVar223,auVar223,3);
          auVar120 = vshufpd_avx(auVar231,auVar231,3);
          _local_560 = auVar155;
          auVar79 = vsubps_avx(auVar155,auVar223);
          auVar220 = vsubps_avx(auVar120,auVar231);
          auVar77._0_4_ = auVar79._0_4_ + auVar220._0_4_;
          auVar77._4_4_ = auVar79._4_4_ + auVar220._4_4_;
          auVar77._8_4_ = auVar79._8_4_ + auVar220._8_4_;
          auVar77._12_4_ = auVar79._12_4_ + auVar220._12_4_;
          auVar79 = vmovshdup_avx(auVar223);
          auVar220 = vmovshdup_avx(auVar179);
          auVar141 = vshufps_avx(auVar77,auVar77,0);
          auVar109 = vshufps_avx(auVar77,auVar77,0x55);
          fVar248 = auVar109._0_4_;
          fVar214 = auVar109._4_4_;
          fVar249 = auVar109._8_4_;
          fVar210 = auVar109._12_4_;
          fVar250 = auVar141._0_4_;
          fVar211 = auVar141._4_4_;
          fVar251 = auVar141._8_4_;
          fVar212 = auVar141._12_4_;
          auVar78._0_4_ = fVar250 * auVar223._0_4_ + auVar79._0_4_ * fVar248;
          auVar78._4_4_ = fVar211 * auVar223._4_4_ + auVar79._4_4_ * fVar214;
          auVar78._8_4_ = fVar251 * auVar223._8_4_ + auVar79._8_4_ * fVar249;
          auVar78._12_4_ = fVar212 * auVar223._12_4_ + auVar79._12_4_ * fVar210;
          auVar291._0_4_ = fVar250 * auVar179._0_4_ + auVar220._0_4_ * fVar248;
          auVar291._4_4_ = fVar211 * auVar179._4_4_ + auVar220._4_4_ * fVar214;
          auVar291._8_4_ = fVar251 * auVar179._8_4_ + auVar220._8_4_ * fVar249;
          auVar291._12_4_ = fVar212 * auVar179._12_4_ + auVar220._12_4_ * fVar210;
          auVar220 = vshufps_avx(auVar78,auVar78,0xe8);
          auVar141 = vshufps_avx(auVar291,auVar291,0xe8);
          auVar79 = vcmpps_avx(auVar220,auVar141,1);
          uVar66 = vextractps_avx(auVar79,0);
          auVar109 = auVar291;
          if ((uVar66 & 1) == 0) {
            auVar109 = auVar78;
          }
          auVar107._0_4_ = auVar108._0_4_ * auVar90._16_4_ * 3.0;
          auVar107._4_4_ = auVar108._4_4_ * auVar90._20_4_ * 3.0;
          auVar107._8_4_ = auVar108._8_4_ * auVar90._24_4_ * 3.0;
          auVar107._12_4_ = auVar108._12_4_ * 0.0;
          auVar74 = vsubps_avx(auVar231,auVar107);
          auVar108 = vmovshdup_avx(auVar74);
          auVar231 = vmovshdup_avx(auVar231);
          fVar228 = auVar74._0_4_;
          fVar229 = auVar74._4_4_;
          auVar200._0_4_ = fVar228 * fVar250 + auVar108._0_4_ * fVar248;
          auVar200._4_4_ = fVar229 * fVar211 + auVar108._4_4_ * fVar214;
          auVar200._8_4_ = auVar74._8_4_ * fVar251 + auVar108._8_4_ * fVar249;
          auVar200._12_4_ = auVar74._12_4_ * fVar212 + auVar108._12_4_ * fVar210;
          auVar331._0_4_ = fVar250 * auVar226._16_4_ + auVar231._0_4_ * fVar248;
          auVar331._4_4_ = fVar211 * auVar226._20_4_ + auVar231._4_4_ * fVar214;
          auVar331._8_4_ = fVar251 * auVar226._24_4_ + auVar231._8_4_ * fVar249;
          auVar331._12_4_ = fVar212 * auVar226._28_4_ + auVar231._12_4_ * fVar210;
          auVar231 = vshufps_avx(auVar200,auVar200,0xe8);
          auVar9 = vshufps_avx(auVar331,auVar331,0xe8);
          auVar108 = vcmpps_avx(auVar231,auVar9,1);
          uVar66 = vextractps_avx(auVar108,0);
          auVar101 = auVar331;
          if ((uVar66 & 1) == 0) {
            auVar101 = auVar200;
          }
          auVar109 = vmaxss_avx(auVar101,auVar109);
          auVar220 = vminps_avx(auVar220,auVar141);
          auVar141 = vminps_avx(auVar231,auVar9);
          auVar141 = vminps_avx(auVar220,auVar141);
          auVar79 = vshufps_avx(auVar79,auVar79,0x55);
          auVar79 = vblendps_avx(auVar79,auVar108,2);
          auVar108 = vpslld_avx(auVar79,0x1f);
          auVar79 = vshufpd_avx(auVar291,auVar291,1);
          auVar79 = vinsertps_avx(auVar79,auVar331,0x9c);
          auVar220 = vshufpd_avx(auVar78,auVar78,1);
          auVar220 = vinsertps_avx(auVar220,auVar200,0x9c);
          auVar79 = vblendvps_avx(auVar220,auVar79,auVar108);
          auVar220 = vmovshdup_avx(auVar79);
          auVar79 = vmaxss_avx(auVar220,auVar79);
          fVar249 = auVar141._0_4_;
          auVar220 = vmovshdup_avx(auVar141);
          fVar214 = auVar79._0_4_;
          fVar210 = auVar220._0_4_;
          fVar248 = auVar109._0_4_;
          if ((fVar249 < 0.0001) && (-0.0001 < fVar214)) break;
          if ((fVar210 < 0.0001 && -0.0001 < fVar248) || (fVar249 < 0.0001 && -0.0001 < fVar248))
          break;
          auVar108 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar79,1);
          auVar220 = vcmpps_avx(auVar220,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar220 = vandps_avx(auVar220,auVar108);
        } while ((auVar220 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar108 = vcmpps_avx(auVar141,_DAT_01f45a50,1);
        auVar220 = vcmpss_avx(auVar109,ZEXT416(0) << 0x20,1);
        auVar140._8_4_ = 0x3f800000;
        auVar140._0_8_ = 0x3f8000003f800000;
        auVar140._12_4_ = 0x3f800000;
        auVar180._8_4_ = 0xbf800000;
        auVar180._0_8_ = 0xbf800000bf800000;
        auVar180._12_4_ = 0xbf800000;
        auVar220 = vblendvps_avx(auVar140,auVar180,auVar220);
        auVar108 = vblendvps_avx(auVar140,auVar180,auVar108);
        auVar141 = vcmpss_avx(auVar108,auVar220,4);
        auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
        auVar141 = vpslld_avx(auVar141,0x1f);
        auVar141 = vpsrad_avx(auVar141,0x1f);
        auVar141 = vpandn_avx(auVar141,_DAT_01f7afb0);
        auVar109 = vmovshdup_avx(auVar108);
        fVar250 = auVar109._0_4_;
        if ((auVar108._0_4_ != fVar250) || (NAN(auVar108._0_4_) || NAN(fVar250))) {
          if ((fVar210 != fVar249) || (NAN(fVar210) || NAN(fVar249))) {
            fVar249 = -fVar249 / (fVar210 - fVar249);
            auVar108 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar249) * 0.0 + fVar249)));
          }
          else {
            auVar108 = ZEXT816(0x3f80000000000000);
            if ((fVar249 != 0.0) || (NAN(fVar249))) {
              auVar108 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar231 = vcmpps_avx(auVar141,auVar108,1);
          auVar109 = vblendps_avx(auVar141,auVar108,2);
          auVar108 = vblendps_avx(auVar108,auVar141,2);
          auVar141 = vblendvps_avx(auVar108,auVar109,auVar231);
        }
        auVar79 = vcmpss_avx(auVar79,ZEXT416(0) << 0x20,1);
        auVar142._8_4_ = 0x3f800000;
        auVar142._0_8_ = 0x3f8000003f800000;
        auVar142._12_4_ = 0x3f800000;
        auVar181._8_4_ = 0xbf800000;
        auVar181._0_8_ = 0xbf800000bf800000;
        auVar181._12_4_ = 0xbf800000;
        auVar79 = vblendvps_avx(auVar142,auVar181,auVar79);
        fVar249 = auVar79._0_4_;
        if ((auVar220._0_4_ != fVar249) || (NAN(auVar220._0_4_) || NAN(fVar249))) {
          if ((fVar214 != fVar248) || (NAN(fVar214) || NAN(fVar248))) {
            fVar248 = -fVar248 / (fVar214 - fVar248);
            auVar79 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar248) * 0.0 + fVar248)));
          }
          else {
            auVar79 = ZEXT816(0x3f80000000000000);
            if ((fVar248 != 0.0) || (NAN(fVar248))) {
              auVar79 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar108 = vcmpps_avx(auVar141,auVar79,1);
          auVar220 = vblendps_avx(auVar141,auVar79,2);
          auVar79 = vblendps_avx(auVar79,auVar141,2);
          auVar141 = vblendvps_avx(auVar79,auVar220,auVar108);
        }
        if ((fVar250 != fVar249) || (NAN(fVar250) || NAN(fVar249))) {
          auVar80._8_4_ = 0x3f800000;
          auVar80._0_8_ = 0x3f8000003f800000;
          auVar80._12_4_ = 0x3f800000;
          auVar79 = vcmpps_avx(auVar141,auVar80,1);
          auVar220 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar143._4_12_ = auVar141._4_12_;
          auVar143._0_4_ = 0x3f800000;
          auVar141 = vblendvps_avx(auVar143,auVar220,auVar79);
        }
        auVar79 = vcmpps_avx(auVar141,_DAT_01f46740,1);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = auVar141._4_12_;
        auVar220 = vinsertps_avx(auVar141,ZEXT416(0x3f800000),0x10);
        auVar79 = vblendvps_avx(auVar220,auVar62 << 0x20,auVar79);
        auVar220 = vmovshdup_avx(auVar79);
      } while (auVar220._0_4_ < auVar79._0_4_);
      auVar81._0_4_ = auVar79._0_4_ + -0.1;
      auVar81._4_4_ = auVar79._4_4_ + 0.1;
      auVar81._8_4_ = auVar79._8_4_ + 0.0;
      auVar81._12_4_ = auVar79._12_4_ + 0.0;
      auVar108 = vshufpd_avx(auVar179,auVar179,3);
      auVar224._8_8_ = 0x3f80000000000000;
      auVar224._0_8_ = 0x3f80000000000000;
      auVar79 = vcmpps_avx(auVar81,auVar224,1);
      auVar61._12_4_ = 0;
      auVar61._0_12_ = auVar81._4_12_;
      auVar220 = vinsertps_avx(auVar81,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar79 = vblendvps_avx(auVar220,auVar61 << 0x20,auVar79);
      auVar220 = vshufpd_avx(auVar74,auVar74,3);
      auVar141 = vshufps_avx(auVar79,auVar79,0x50);
      auVar322._8_4_ = 0x3f800000;
      auVar322._0_8_ = 0x3f8000003f800000;
      auVar322._12_4_ = 0x3f800000;
      auVar109 = vsubps_avx(auVar322,auVar141);
      local_560._0_4_ = auVar155._0_4_;
      local_560._4_4_ = auVar155._4_4_;
      fStack_558 = auVar155._8_4_;
      fStack_554 = auVar155._12_4_;
      fVar248 = auVar141._0_4_;
      fVar214 = auVar141._4_4_;
      fVar249 = auVar141._8_4_;
      fVar210 = auVar141._12_4_;
      local_6a0 = auVar120._0_4_;
      fStack_69c = auVar120._4_4_;
      fStack_698 = auVar120._8_4_;
      fStack_694 = auVar120._12_4_;
      fVar250 = auVar109._0_4_;
      fVar211 = auVar109._4_4_;
      fVar251 = auVar109._8_4_;
      fVar212 = auVar109._12_4_;
      auVar82._0_4_ = fVar248 * (float)local_560._0_4_ + fVar250 * auVar223._0_4_;
      auVar82._4_4_ = fVar214 * (float)local_560._4_4_ + fVar211 * auVar223._4_4_;
      auVar82._8_4_ = fVar249 * fStack_558 + fVar251 * auVar223._0_4_;
      auVar82._12_4_ = fVar210 * fStack_554 + fVar212 * auVar223._4_4_;
      auVar201._0_4_ = auVar108._0_4_ * fVar248 + fVar250 * auVar179._0_4_;
      auVar201._4_4_ = auVar108._4_4_ * fVar214 + fVar211 * auVar179._4_4_;
      auVar201._8_4_ = auVar108._8_4_ * fVar249 + fVar251 * auVar179._0_4_;
      auVar201._12_4_ = auVar108._12_4_ * fVar210 + fVar212 * auVar179._4_4_;
      auVar241._0_4_ = auVar220._0_4_ * fVar248 + fVar250 * fVar228;
      auVar241._4_4_ = auVar220._4_4_ * fVar214 + fVar211 * fVar229;
      auVar241._8_4_ = auVar220._8_4_ * fVar249 + fVar251 * fVar228;
      auVar241._12_4_ = auVar220._12_4_ * fVar210 + fVar212 * fVar229;
      auVar279._0_4_ = fVar248 * local_6a0 + fVar250 * auVar226._16_4_;
      auVar279._4_4_ = fVar214 * fStack_69c + fVar211 * auVar226._20_4_;
      auVar279._8_4_ = fVar249 * fStack_698 + fVar251 * auVar226._16_4_;
      auVar279._12_4_ = fVar210 * fStack_694 + fVar212 * auVar226._20_4_;
      auVar120 = vsubps_avx(auVar322,auVar79);
      auVar220 = vmovshdup_avx(auVar321);
      auVar155 = vmovsldup_avx(auVar321);
      auVar332._0_4_ = auVar120._0_4_ * auVar155._0_4_ + auVar79._0_4_ * auVar220._0_4_;
      auVar332._4_4_ = auVar120._4_4_ * auVar155._4_4_ + auVar79._4_4_ * auVar220._4_4_;
      auVar332._8_4_ = auVar120._8_4_ * auVar155._8_4_ + auVar79._8_4_ * auVar220._8_4_;
      auVar332._12_4_ = auVar120._12_4_ * auVar155._12_4_ + auVar79._12_4_ * auVar220._12_4_;
      auVar74 = vmovshdup_avx(auVar332);
      auVar79 = vsubps_avx(auVar201,auVar82);
      auVar144._0_4_ = auVar79._0_4_ * 3.0;
      auVar144._4_4_ = auVar79._4_4_ * 3.0;
      auVar144._8_4_ = auVar79._8_4_ * 3.0;
      auVar144._12_4_ = auVar79._12_4_ * 3.0;
      auVar79 = vsubps_avx(auVar241,auVar201);
      auVar166._0_4_ = auVar79._0_4_ * 3.0;
      auVar166._4_4_ = auVar79._4_4_ * 3.0;
      auVar166._8_4_ = auVar79._8_4_ * 3.0;
      auVar166._12_4_ = auVar79._12_4_ * 3.0;
      auVar79 = vsubps_avx(auVar279,auVar241);
      auVar259._0_4_ = auVar79._0_4_ * 3.0;
      auVar259._4_4_ = auVar79._4_4_ * 3.0;
      auVar259._8_4_ = auVar79._8_4_ * 3.0;
      auVar259._12_4_ = auVar79._12_4_ * 3.0;
      auVar220 = vminps_avx(auVar166,auVar259);
      auVar79 = vmaxps_avx(auVar166,auVar259);
      auVar220 = vminps_avx(auVar144,auVar220);
      auVar79 = vmaxps_avx(auVar144,auVar79);
      auVar155 = vshufpd_avx(auVar220,auVar220,3);
      auVar120 = vshufpd_avx(auVar79,auVar79,3);
      auVar220 = vminps_avx(auVar220,auVar155);
      auVar79 = vmaxps_avx(auVar79,auVar120);
      auVar155 = vshufps_avx(ZEXT416((uint)(1.0 / fVar247)),ZEXT416((uint)(1.0 / fVar247)),0);
      auVar260._0_4_ = auVar155._0_4_ * auVar220._0_4_;
      auVar260._4_4_ = auVar155._4_4_ * auVar220._4_4_;
      auVar260._8_4_ = auVar155._8_4_ * auVar220._8_4_;
      auVar260._12_4_ = auVar155._12_4_ * auVar220._12_4_;
      auVar270._0_4_ = auVar155._0_4_ * auVar79._0_4_;
      auVar270._4_4_ = auVar155._4_4_ * auVar79._4_4_;
      auVar270._8_4_ = auVar155._8_4_ * auVar79._8_4_;
      auVar270._12_4_ = auVar155._12_4_ * auVar79._12_4_;
      auVar109 = ZEXT416((uint)(1.0 / (auVar74._0_4_ - auVar332._0_4_)));
      auVar79 = vshufpd_avx(auVar82,auVar82,3);
      auVar220 = vshufpd_avx(auVar201,auVar201,3);
      auVar155 = vshufpd_avx(auVar241,auVar241,3);
      auVar120 = vshufpd_avx(auVar279,auVar279,3);
      auVar79 = vsubps_avx(auVar79,auVar82);
      auVar108 = vsubps_avx(auVar220,auVar201);
      auVar141 = vsubps_avx(auVar155,auVar241);
      auVar120 = vsubps_avx(auVar120,auVar279);
      auVar220 = vminps_avx(auVar79,auVar108);
      auVar79 = vmaxps_avx(auVar79,auVar108);
      auVar155 = vminps_avx(auVar141,auVar120);
      auVar155 = vminps_avx(auVar220,auVar155);
      auVar220 = vmaxps_avx(auVar141,auVar120);
      auVar79 = vmaxps_avx(auVar79,auVar220);
      auVar220 = vshufps_avx(auVar109,auVar109,0);
      auVar312._0_4_ = auVar220._0_4_ * auVar155._0_4_;
      auVar312._4_4_ = auVar220._4_4_ * auVar155._4_4_;
      auVar312._8_4_ = auVar220._8_4_ * auVar155._8_4_;
      auVar312._12_4_ = auVar220._12_4_ * auVar155._12_4_;
      auVar323._0_4_ = auVar220._0_4_ * auVar79._0_4_;
      auVar323._4_4_ = auVar220._4_4_ * auVar79._4_4_;
      auVar323._8_4_ = auVar220._8_4_ * auVar79._8_4_;
      auVar323._12_4_ = auVar220._12_4_ * auVar79._12_4_;
      auVar79 = vmovsldup_avx(auVar332);
      auVar280._4_12_ = auVar79._4_12_;
      auVar280._0_4_ = fVar209;
      auVar292._4_12_ = auVar332._4_12_;
      auVar292._0_4_ = fVar192;
      auVar167._0_4_ = (fVar209 + fVar192) * 0.5;
      auVar167._4_4_ = (auVar79._4_4_ + auVar332._4_4_) * 0.5;
      auVar167._8_4_ = (auVar79._8_4_ + auVar332._8_4_) * 0.5;
      auVar167._12_4_ = (auVar79._12_4_ + auVar332._12_4_) * 0.5;
      auVar79 = vshufps_avx(auVar167,auVar167,0);
      fVar248 = auVar79._0_4_;
      fVar214 = auVar79._4_4_;
      fVar249 = auVar79._8_4_;
      fVar210 = auVar79._12_4_;
      local_5b0 = auVar6._0_4_;
      fStack_5ac = auVar6._4_4_;
      fStack_5a8 = auVar6._8_4_;
      fStack_5a4 = auVar6._12_4_;
      auVar110._0_4_ = fVar248 * (float)local_370._0_4_ + local_5b0;
      auVar110._4_4_ = fVar214 * (float)local_370._4_4_ + fStack_5ac;
      auVar110._8_4_ = fVar249 * fStack_368 + fStack_5a8;
      auVar110._12_4_ = fVar210 * fStack_364 + fStack_5a4;
      local_5c0 = auVar7._0_4_;
      fStack_5bc = auVar7._4_4_;
      fStack_5b8 = auVar7._8_4_;
      fStack_5b4 = auVar7._12_4_;
      auVar145._0_4_ = fVar248 * (float)local_380._0_4_ + local_5c0;
      auVar145._4_4_ = fVar214 * (float)local_380._4_4_ + fStack_5bc;
      auVar145._8_4_ = fVar249 * fStack_378 + fStack_5b8;
      auVar145._12_4_ = fVar210 * fStack_374 + fStack_5b4;
      local_5d0 = auVar8._0_4_;
      fStack_5cc = auVar8._4_4_;
      fStack_5c8 = auVar8._8_4_;
      fStack_5c4 = auVar8._12_4_;
      auVar202._0_4_ = fVar248 * (float)local_390._0_4_ + local_5d0;
      auVar202._4_4_ = fVar214 * (float)local_390._4_4_ + fStack_5cc;
      auVar202._8_4_ = fVar249 * fStack_388 + fStack_5c8;
      auVar202._12_4_ = fVar210 * fStack_384 + fStack_5c4;
      auVar79 = vsubps_avx(auVar145,auVar110);
      auVar111._0_4_ = auVar110._0_4_ + fVar248 * auVar79._0_4_;
      auVar111._4_4_ = auVar110._4_4_ + fVar214 * auVar79._4_4_;
      auVar111._8_4_ = auVar110._8_4_ + fVar249 * auVar79._8_4_;
      auVar111._12_4_ = auVar110._12_4_ + fVar210 * auVar79._12_4_;
      auVar79 = vsubps_avx(auVar202,auVar145);
      auVar146._0_4_ = auVar145._0_4_ + fVar248 * auVar79._0_4_;
      auVar146._4_4_ = auVar145._4_4_ + fVar214 * auVar79._4_4_;
      auVar146._8_4_ = auVar145._8_4_ + fVar249 * auVar79._8_4_;
      auVar146._12_4_ = auVar145._12_4_ + fVar210 * auVar79._12_4_;
      auVar79 = vsubps_avx(auVar146,auVar111);
      fVar248 = auVar111._0_4_ + fVar248 * auVar79._0_4_;
      fVar214 = auVar111._4_4_ + fVar214 * auVar79._4_4_;
      auVar83._0_8_ = CONCAT44(fVar214,fVar248);
      auVar83._8_4_ = auVar111._8_4_ + fVar249 * auVar79._8_4_;
      auVar83._12_4_ = auVar111._12_4_ + fVar210 * auVar79._12_4_;
      fVar249 = auVar79._0_4_ * 3.0;
      fVar210 = auVar79._4_4_ * 3.0;
      auVar112._0_8_ = CONCAT44(fVar210,fVar249);
      auVar112._8_4_ = auVar79._8_4_ * 3.0;
      auVar112._12_4_ = auVar79._12_4_ * 3.0;
      auVar147._8_8_ = auVar83._0_8_;
      auVar147._0_8_ = auVar83._0_8_;
      auVar79 = vshufpd_avx(auVar83,auVar83,3);
      auVar220 = vshufps_avx(auVar167,auVar167,0x55);
      auVar141 = vsubps_avx(auVar79,auVar147);
      auVar301._0_4_ = auVar141._0_4_ * auVar220._0_4_ + fVar248;
      auVar301._4_4_ = auVar141._4_4_ * auVar220._4_4_ + fVar214;
      auVar301._8_4_ = auVar141._8_4_ * auVar220._8_4_ + fVar248;
      auVar301._12_4_ = auVar141._12_4_ * auVar220._12_4_ + fVar214;
      auVar148._8_8_ = auVar112._0_8_;
      auVar148._0_8_ = auVar112._0_8_;
      auVar79 = vshufpd_avx(auVar112,auVar112,1);
      auVar79 = vsubps_avx(auVar79,auVar148);
      auVar113._0_4_ = auVar79._0_4_ * auVar220._0_4_ + fVar249;
      auVar113._4_4_ = auVar79._4_4_ * auVar220._4_4_ + fVar210;
      auVar113._8_4_ = auVar79._8_4_ * auVar220._8_4_ + fVar249;
      auVar113._12_4_ = auVar79._12_4_ * auVar220._12_4_ + fVar210;
      auVar220 = vmovshdup_avx(auVar113);
      auVar203._0_8_ = auVar220._0_8_ ^ 0x8000000080000000;
      auVar203._8_4_ = auVar220._8_4_ ^ 0x80000000;
      auVar203._12_4_ = auVar220._12_4_ ^ 0x80000000;
      auVar155 = vmovshdup_avx(auVar141);
      auVar79 = vunpcklps_avx(auVar155,auVar203);
      auVar120 = vshufps_avx(auVar79,auVar203,4);
      auVar84._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
      auVar84._8_4_ = -auVar141._8_4_;
      auVar84._12_4_ = -auVar141._12_4_;
      auVar79 = vmovlhps_avx(auVar84,auVar113);
      auVar108 = vshufps_avx(auVar79,auVar113,8);
      auVar79 = ZEXT416((uint)(auVar113._0_4_ * auVar155._0_4_ - auVar141._0_4_ * auVar220._0_4_));
      auVar220 = vshufps_avx(auVar79,auVar79,0);
      auVar79 = vdivps_avx(auVar120,auVar220);
      auVar220 = vdivps_avx(auVar108,auVar220);
      auVar108 = vinsertps_avx(auVar260,auVar312,0x1c);
      auVar141 = vinsertps_avx(auVar270,auVar323,0x1c);
      auVar109 = vinsertps_avx(auVar312,auVar260,0x4c);
      auVar231 = vinsertps_avx(auVar323,auVar270,0x4c);
      auVar155 = vmovsldup_avx(auVar79);
      auVar149._0_4_ = auVar155._0_4_ * auVar108._0_4_;
      auVar149._4_4_ = auVar155._4_4_ * auVar108._4_4_;
      auVar149._8_4_ = auVar155._8_4_ * auVar108._8_4_;
      auVar149._12_4_ = auVar155._12_4_ * auVar108._12_4_;
      auVar114._0_4_ = auVar141._0_4_ * auVar155._0_4_;
      auVar114._4_4_ = auVar141._4_4_ * auVar155._4_4_;
      auVar114._8_4_ = auVar141._8_4_ * auVar155._8_4_;
      auVar114._12_4_ = auVar141._12_4_ * auVar155._12_4_;
      auVar120 = vminps_avx(auVar149,auVar114);
      auVar155 = vmaxps_avx(auVar114,auVar149);
      auVar9 = vmovsldup_avx(auVar220);
      auVar324._0_4_ = auVar109._0_4_ * auVar9._0_4_;
      auVar324._4_4_ = auVar109._4_4_ * auVar9._4_4_;
      auVar324._8_4_ = auVar109._8_4_ * auVar9._8_4_;
      auVar324._12_4_ = auVar109._12_4_ * auVar9._12_4_;
      auVar150._0_4_ = auVar231._0_4_ * auVar9._0_4_;
      auVar150._4_4_ = auVar231._4_4_ * auVar9._4_4_;
      auVar150._8_4_ = auVar231._8_4_ * auVar9._8_4_;
      auVar150._12_4_ = auVar231._12_4_ * auVar9._12_4_;
      auVar9 = vminps_avx(auVar324,auVar150);
      auVar182._0_4_ = auVar120._0_4_ + auVar9._0_4_;
      auVar182._4_4_ = auVar120._4_4_ + auVar9._4_4_;
      auVar182._8_4_ = auVar120._8_4_ + auVar9._8_4_;
      auVar182._12_4_ = auVar120._12_4_ + auVar9._12_4_;
      auVar120 = vmaxps_avx(auVar150,auVar324);
      auVar9 = vsubps_avx(auVar280,auVar167);
      auVar101 = vsubps_avx(auVar292,auVar167);
      auVar115._0_4_ = auVar155._0_4_ + auVar120._0_4_;
      auVar115._4_4_ = auVar155._4_4_ + auVar120._4_4_;
      auVar115._8_4_ = auVar155._8_4_ + auVar120._8_4_;
      auVar115._12_4_ = auVar155._12_4_ + auVar120._12_4_;
      auVar151._8_8_ = 0x3f800000;
      auVar151._0_8_ = 0x3f800000;
      auVar155 = vsubps_avx(auVar151,auVar115);
      auVar120 = vsubps_avx(auVar151,auVar182);
      fVar251 = auVar9._0_4_;
      auVar183._0_4_ = fVar251 * auVar155._0_4_;
      fVar212 = auVar9._4_4_;
      auVar183._4_4_ = fVar212 * auVar155._4_4_;
      fVar228 = auVar9._8_4_;
      auVar183._8_4_ = fVar228 * auVar155._8_4_;
      fVar229 = auVar9._12_4_;
      auVar183._12_4_ = fVar229 * auVar155._12_4_;
      fVar249 = auVar101._0_4_;
      auVar116._0_4_ = fVar249 * auVar155._0_4_;
      fVar210 = auVar101._4_4_;
      auVar116._4_4_ = fVar210 * auVar155._4_4_;
      fVar250 = auVar101._8_4_;
      auVar116._8_4_ = fVar250 * auVar155._8_4_;
      fVar211 = auVar101._12_4_;
      auVar116._12_4_ = fVar211 * auVar155._12_4_;
      auVar281._0_4_ = fVar251 * auVar120._0_4_;
      auVar281._4_4_ = fVar212 * auVar120._4_4_;
      auVar281._8_4_ = fVar228 * auVar120._8_4_;
      auVar281._12_4_ = fVar229 * auVar120._12_4_;
      auVar152._0_4_ = fVar249 * auVar120._0_4_;
      auVar152._4_4_ = fVar210 * auVar120._4_4_;
      auVar152._8_4_ = fVar250 * auVar120._8_4_;
      auVar152._12_4_ = fVar211 * auVar120._12_4_;
      auVar155 = vminps_avx(auVar183,auVar281);
      auVar120 = vminps_avx(auVar116,auVar152);
      auVar9 = vminps_avx(auVar155,auVar120);
      auVar155 = vmaxps_avx(auVar281,auVar183);
      auVar120 = vmaxps_avx(auVar152,auVar116);
      auVar101 = vshufps_avx(auVar167,auVar167,0x54);
      auVar120 = vmaxps_avx(auVar120,auVar155);
      auVar102 = vshufps_avx(auVar301,auVar301,0);
      auVar134 = vshufps_avx(auVar301,auVar301,0x55);
      auVar155 = vhaddps_avx(auVar9,auVar9);
      auVar120 = vhaddps_avx(auVar120,auVar120);
      auVar168._0_4_ = auVar102._0_4_ * auVar79._0_4_ + auVar134._0_4_ * auVar220._0_4_;
      auVar168._4_4_ = auVar102._4_4_ * auVar79._4_4_ + auVar134._4_4_ * auVar220._4_4_;
      auVar168._8_4_ = auVar102._8_4_ * auVar79._8_4_ + auVar134._8_4_ * auVar220._8_4_;
      auVar168._12_4_ = auVar102._12_4_ * auVar79._12_4_ + auVar134._12_4_ * auVar220._12_4_;
      auVar9 = vsubps_avx(auVar101,auVar168);
      fVar248 = auVar9._0_4_ + auVar155._0_4_;
      fVar214 = auVar9._0_4_ + auVar120._0_4_;
      auVar155 = vmaxss_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar248));
      auVar120 = vminss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar192));
    } while (auVar120._0_4_ < auVar155._0_4_);
    auVar155 = vmovshdup_avx(auVar79);
    auVar85._0_4_ = auVar155._0_4_ * auVar108._0_4_;
    auVar85._4_4_ = auVar155._4_4_ * auVar108._4_4_;
    auVar85._8_4_ = auVar155._8_4_ * auVar108._8_4_;
    auVar85._12_4_ = auVar155._12_4_ * auVar108._12_4_;
    auVar117._0_4_ = auVar141._0_4_ * auVar155._0_4_;
    auVar117._4_4_ = auVar141._4_4_ * auVar155._4_4_;
    auVar117._8_4_ = auVar141._8_4_ * auVar155._8_4_;
    auVar117._12_4_ = auVar141._12_4_ * auVar155._12_4_;
    auVar120 = vminps_avx(auVar85,auVar117);
    auVar155 = vmaxps_avx(auVar117,auVar85);
    auVar108 = vmovshdup_avx(auVar220);
    auVar184._0_4_ = auVar109._0_4_ * auVar108._0_4_;
    auVar184._4_4_ = auVar109._4_4_ * auVar108._4_4_;
    auVar184._8_4_ = auVar109._8_4_ * auVar108._8_4_;
    auVar184._12_4_ = auVar109._12_4_ * auVar108._12_4_;
    auVar118._0_4_ = auVar231._0_4_ * auVar108._0_4_;
    auVar118._4_4_ = auVar231._4_4_ * auVar108._4_4_;
    auVar118._8_4_ = auVar231._8_4_ * auVar108._8_4_;
    auVar118._12_4_ = auVar231._12_4_ * auVar108._12_4_;
    auVar108 = vminps_avx(auVar184,auVar118);
    auVar153._0_4_ = auVar120._0_4_ + auVar108._0_4_;
    auVar153._4_4_ = auVar120._4_4_ + auVar108._4_4_;
    auVar153._8_4_ = auVar120._8_4_ + auVar108._8_4_;
    auVar153._12_4_ = auVar120._12_4_ + auVar108._12_4_;
    auVar120 = vmaxps_avx(auVar118,auVar184);
    auVar86._0_4_ = auVar155._0_4_ + auVar120._0_4_;
    auVar86._4_4_ = auVar155._4_4_ + auVar120._4_4_;
    auVar86._8_4_ = auVar155._8_4_ + auVar120._8_4_;
    auVar86._12_4_ = auVar155._12_4_ + auVar120._12_4_;
    auVar155 = vsubps_avx(auVar224,auVar86);
    auVar120 = vsubps_avx(auVar224,auVar153);
    auVar154._0_4_ = fVar251 * auVar155._0_4_;
    auVar154._4_4_ = fVar212 * auVar155._4_4_;
    auVar154._8_4_ = fVar228 * auVar155._8_4_;
    auVar154._12_4_ = fVar229 * auVar155._12_4_;
    auVar185._0_4_ = fVar251 * auVar120._0_4_;
    auVar185._4_4_ = fVar212 * auVar120._4_4_;
    auVar185._8_4_ = fVar228 * auVar120._8_4_;
    auVar185._12_4_ = fVar229 * auVar120._12_4_;
    auVar87._0_4_ = fVar249 * auVar155._0_4_;
    auVar87._4_4_ = fVar210 * auVar155._4_4_;
    auVar87._8_4_ = fVar250 * auVar155._8_4_;
    auVar87._12_4_ = fVar211 * auVar155._12_4_;
    auVar119._0_4_ = fVar249 * auVar120._0_4_;
    auVar119._4_4_ = fVar210 * auVar120._4_4_;
    auVar119._8_4_ = fVar250 * auVar120._8_4_;
    auVar119._12_4_ = fVar211 * auVar120._12_4_;
    auVar155 = vminps_avx(auVar154,auVar185);
    auVar120 = vminps_avx(auVar87,auVar119);
    auVar155 = vminps_avx(auVar155,auVar120);
    auVar120 = vmaxps_avx(auVar185,auVar154);
    auVar108 = vmaxps_avx(auVar119,auVar87);
    auVar155 = vhaddps_avx(auVar155,auVar155);
    auVar120 = vmaxps_avx(auVar108,auVar120);
    auVar120 = vhaddps_avx(auVar120,auVar120);
    auVar108 = vmovshdup_avx(auVar9);
    auVar141 = ZEXT416((uint)(auVar108._0_4_ + auVar155._0_4_));
    auVar155 = vmaxss_avx(auVar332,auVar141);
    auVar108 = ZEXT416((uint)(auVar108._0_4_ + auVar120._0_4_));
    auVar120 = vminss_avx(auVar108,auVar74);
  } while (auVar120._0_4_ < auVar155._0_4_);
  uVar66 = 0;
  if ((fVar209 < fVar248) && (fVar214 < fVar192)) {
    auVar155 = vcmpps_avx(auVar108,auVar74,1);
    auVar120 = vcmpps_avx(auVar332,auVar141,1);
    auVar155 = vandps_avx(auVar120,auVar155);
    uVar66 = auVar155._0_4_;
  }
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  if (((uint)uVar72 < 4 && 0.001 <= fVar247) && (uVar66 & 1) == 0) goto LAB_009fc5e8;
  lVar69 = 0xc9;
  do {
    lVar69 = lVar69 + -1;
    if (lVar69 == 0) goto LAB_009fb5e0;
    fVar247 = auVar9._0_4_;
    fVar192 = 1.0 - fVar247;
    auVar155 = ZEXT416((uint)(fVar192 * fVar192 * fVar192));
    auVar155 = vshufps_avx(auVar155,auVar155,0);
    auVar120 = ZEXT416((uint)(fVar247 * 3.0 * fVar192 * fVar192));
    auVar120 = vshufps_avx(auVar120,auVar120,0);
    auVar108 = ZEXT416((uint)(fVar192 * fVar247 * fVar247 * 3.0));
    auVar108 = vshufps_avx(auVar108,auVar108,0);
    auVar141 = ZEXT416((uint)(fVar247 * fVar247 * fVar247));
    auVar141 = vshufps_avx(auVar141,auVar141,0);
    fVar192 = local_5b0 * auVar155._0_4_ +
              local_5c0 * auVar120._0_4_ +
              (float)local_3a0._0_4_ * auVar141._0_4_ + local_5d0 * auVar108._0_4_;
    fVar247 = fStack_5ac * auVar155._4_4_ +
              fStack_5bc * auVar120._4_4_ +
              (float)local_3a0._4_4_ * auVar141._4_4_ + fStack_5cc * auVar108._4_4_;
    auVar88._0_8_ = CONCAT44(fVar247,fVar192);
    auVar88._8_4_ =
         fStack_5a8 * auVar155._8_4_ +
         fStack_5b8 * auVar120._8_4_ + fStack_398 * auVar141._8_4_ + fStack_5c8 * auVar108._8_4_;
    auVar88._12_4_ =
         fStack_5a4 * auVar155._12_4_ +
         fStack_5b4 * auVar120._12_4_ + fStack_394 * auVar141._12_4_ + fStack_5c4 * auVar108._12_4_;
    auVar121._8_8_ = auVar88._0_8_;
    auVar121._0_8_ = auVar88._0_8_;
    auVar120 = vshufpd_avx(auVar88,auVar88,1);
    auVar155 = vmovshdup_avx(auVar9);
    auVar120 = vsubps_avx(auVar120,auVar121);
    auVar89._0_4_ = auVar155._0_4_ * auVar120._0_4_ + fVar192;
    auVar89._4_4_ = auVar155._4_4_ * auVar120._4_4_ + fVar247;
    auVar89._8_4_ = auVar155._8_4_ * auVar120._8_4_ + fVar192;
    auVar89._12_4_ = auVar155._12_4_ * auVar120._12_4_ + fVar247;
    auVar155 = vshufps_avx(auVar89,auVar89,0);
    auVar120 = vshufps_avx(auVar89,auVar89,0x55);
    auVar122._0_4_ = auVar79._0_4_ * auVar155._0_4_ + auVar220._0_4_ * auVar120._0_4_;
    auVar122._4_4_ = auVar79._4_4_ * auVar155._4_4_ + auVar220._4_4_ * auVar120._4_4_;
    auVar122._8_4_ = auVar79._8_4_ * auVar155._8_4_ + auVar220._8_4_ * auVar120._8_4_;
    auVar122._12_4_ = auVar79._12_4_ * auVar155._12_4_ + auVar220._12_4_ * auVar120._12_4_;
    auVar9 = vsubps_avx(auVar9,auVar122);
    auVar155 = vandps_avx(auVar261,auVar89);
    auVar120 = vshufps_avx(auVar155,auVar155,0xf5);
    auVar155 = vmaxss_avx(auVar120,auVar155);
  } while ((float)local_3b0._0_4_ <= auVar155._0_4_);
  fVar192 = auVar9._0_4_;
  if ((fVar192 < 0.0) || (1.0 < fVar192)) goto LAB_009fb5e0;
  auVar79 = vmovshdup_avx(auVar9);
  fVar247 = auVar79._0_4_;
  if ((fVar247 < 0.0) || (1.0 < fVar247)) goto LAB_009fb5e0;
  auVar79 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar231 = vinsertps_avx(auVar79,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar79 = vdpps_avx(auVar231,local_3c0,0x7f);
  auVar220 = vdpps_avx(auVar231,local_3d0,0x7f);
  auVar155 = vdpps_avx(auVar231,local_400,0x7f);
  auVar120 = vdpps_avx(auVar231,local_410,0x7f);
  auVar108 = vdpps_avx(auVar231,local_420,0x7f);
  auVar141 = vdpps_avx(auVar231,local_430,0x7f);
  fVar210 = 1.0 - fVar247;
  auVar109 = vdpps_avx(auVar231,local_3e0,0x7f);
  auVar231 = vdpps_avx(auVar231,local_3f0,0x7f);
  fVar250 = 1.0 - fVar192;
  fVar209 = auVar9._4_4_;
  fVar248 = auVar9._8_4_;
  fVar214 = auVar9._12_4_;
  fVar249 = fVar250 * fVar192 * fVar192 * 3.0;
  auVar204._0_4_ = fVar192 * fVar192 * fVar192;
  auVar204._4_4_ = fVar209 * fVar209 * fVar209;
  auVar204._8_4_ = fVar248 * fVar248 * fVar248;
  auVar204._12_4_ = fVar214 * fVar214 * fVar214;
  fVar209 = fVar192 * 3.0 * fVar250 * fVar250;
  fVar248 = fVar250 * fVar250 * fVar250;
  fVar192 = (fVar210 * auVar79._0_4_ + fVar247 * auVar155._0_4_) * fVar248 +
            (fVar210 * auVar220._0_4_ + fVar247 * auVar120._0_4_) * fVar209 +
            fVar249 * (fVar210 * auVar109._0_4_ + fVar247 * auVar108._0_4_) +
            auVar204._0_4_ * (auVar141._0_4_ * fVar247 + fVar210 * auVar231._0_4_);
  if ((fVar192 < fVar234) || (fVar247 = *(float *)(ray + k * 4 + 0x100), fVar247 < fVar192))
  goto LAB_009fb5e0;
  pGVar11 = (context->scene->geometries).items[uVar67].ptr;
  if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar64 = 1, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_009fc5bc;
    local_f0 = vshufps_avx(auVar9,auVar9,0x55);
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar79 = vsubps_avx(auVar262,local_f0);
    fVar214 = local_f0._0_4_;
    fVar210 = local_f0._4_4_;
    fVar211 = local_f0._8_4_;
    fVar251 = local_f0._12_4_;
    fVar212 = auVar79._0_4_;
    fVar228 = auVar79._4_4_;
    fVar229 = auVar79._8_4_;
    fVar230 = auVar79._12_4_;
    auVar271._0_4_ = fVar214 * (float)local_4f0._0_4_ + fVar212 * (float)local_4e0._0_4_;
    auVar271._4_4_ = fVar210 * (float)local_4f0._4_4_ + fVar228 * (float)local_4e0._4_4_;
    auVar271._8_4_ = fVar211 * fStack_4e8 + fVar229 * fStack_4d8;
    auVar271._12_4_ = fVar251 * fStack_4e4 + fVar230 * fStack_4d4;
    auVar282._0_4_ = fVar214 * (float)local_540._0_4_ + fVar212 * (float)local_520._0_4_;
    auVar282._4_4_ = fVar210 * (float)local_540._4_4_ + fVar228 * (float)local_520._4_4_;
    auVar282._8_4_ = fVar211 * fStack_538 + fVar229 * fStack_518;
    auVar282._12_4_ = fVar251 * fStack_534 + fVar230 * fStack_514;
    auVar293._0_4_ = fVar214 * (float)local_450._0_4_ + fVar212 * (float)local_530._0_4_;
    auVar293._4_4_ = fVar210 * (float)local_450._4_4_ + fVar228 * (float)local_530._4_4_;
    auVar293._8_4_ = fVar211 * fStack_448 + fVar229 * fStack_528;
    auVar293._12_4_ = fVar251 * fStack_444 + fVar230 * fStack_524;
    auVar263._0_4_ = fVar214 * (float)local_510._0_4_ + fVar212 * (float)local_500._0_4_;
    auVar263._4_4_ = fVar210 * (float)local_510._4_4_ + fVar228 * (float)local_500._4_4_;
    auVar263._8_4_ = fVar211 * fStack_508 + fVar229 * fStack_4f8;
    auVar263._12_4_ = fVar251 * fStack_504 + fVar230 * fStack_4f4;
    auVar120 = vsubps_avx(auVar282,auVar271);
    auVar108 = vsubps_avx(auVar293,auVar282);
    auVar141 = vsubps_avx(auVar263,auVar293);
    local_110 = vshufps_avx(auVar9,auVar9,0);
    fVar214 = local_110._0_4_;
    fVar211 = local_110._4_4_;
    fVar251 = local_110._8_4_;
    fVar228 = local_110._12_4_;
    auVar79 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
    fVar210 = auVar79._0_4_;
    fVar250 = auVar79._4_4_;
    fVar212 = auVar79._8_4_;
    fVar229 = auVar79._12_4_;
    auVar79 = vshufps_avx(auVar204,auVar204,0);
    auVar220 = vshufps_avx(ZEXT416((uint)fVar249),ZEXT416((uint)fVar249),0);
    auVar155 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
    auVar186._0_4_ =
         ((auVar108._0_4_ * fVar210 + auVar141._0_4_ * fVar214) * fVar214 +
         (auVar120._0_4_ * fVar210 + auVar108._0_4_ * fVar214) * fVar210) * 3.0;
    auVar186._4_4_ =
         ((auVar108._4_4_ * fVar250 + auVar141._4_4_ * fVar211) * fVar211 +
         (auVar120._4_4_ * fVar250 + auVar108._4_4_ * fVar211) * fVar250) * 3.0;
    auVar186._8_4_ =
         ((auVar108._8_4_ * fVar212 + auVar141._8_4_ * fVar251) * fVar251 +
         (auVar120._8_4_ * fVar212 + auVar108._8_4_ * fVar251) * fVar212) * 3.0;
    auVar186._12_4_ =
         ((auVar108._12_4_ * fVar229 + auVar141._12_4_ * fVar228) * fVar228 +
         (auVar120._12_4_ * fVar229 + auVar108._12_4_ * fVar228) * fVar229) * 3.0;
    auVar120 = vshufps_avx(ZEXT416((uint)fVar248),ZEXT416((uint)fVar248),0);
    auVar123._0_4_ =
         auVar120._0_4_ * (float)local_460._0_4_ +
         auVar155._0_4_ * (float)local_470._0_4_ +
         auVar79._0_4_ * (float)local_490._0_4_ + auVar220._0_4_ * (float)local_480._0_4_;
    auVar123._4_4_ =
         auVar120._4_4_ * (float)local_460._4_4_ +
         auVar155._4_4_ * (float)local_470._4_4_ +
         auVar79._4_4_ * (float)local_490._4_4_ + auVar220._4_4_ * (float)local_480._4_4_;
    auVar123._8_4_ =
         auVar120._8_4_ * fStack_458 +
         auVar155._8_4_ * fStack_468 + auVar79._8_4_ * fStack_488 + auVar220._8_4_ * fStack_478;
    auVar123._12_4_ =
         auVar120._12_4_ * fStack_454 +
         auVar155._12_4_ * fStack_464 + auVar79._12_4_ * fStack_484 + auVar220._12_4_ * fStack_474;
    auVar79 = vshufps_avx(auVar186,auVar186,0xc9);
    auVar156._0_4_ = auVar123._0_4_ * auVar79._0_4_;
    auVar156._4_4_ = auVar123._4_4_ * auVar79._4_4_;
    auVar156._8_4_ = auVar123._8_4_ * auVar79._8_4_;
    auVar156._12_4_ = auVar123._12_4_ * auVar79._12_4_;
    auVar79 = vshufps_avx(auVar123,auVar123,0xc9);
    auVar124._0_4_ = auVar186._0_4_ * auVar79._0_4_;
    auVar124._4_4_ = auVar186._4_4_ * auVar79._4_4_;
    auVar124._8_4_ = auVar186._8_4_ * auVar79._8_4_;
    auVar124._12_4_ = auVar186._12_4_ * auVar79._12_4_;
    auVar79 = vsubps_avx(auVar124,auVar156);
    local_170 = vshufps_avx(auVar79,auVar79,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar79,auVar79,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar79,auVar79,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_340._0_8_;
    uStack_d8 = local_340._8_8_;
    uStack_d0 = local_340._16_8_;
    uStack_c8 = local_340._24_8_;
    local_c0 = local_320;
    vcmpps_avx(local_320,local_320,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar192;
    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar65 & 0xf) << 4));
    local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar65 >> 4) * 0x10);
    local_4c0.valid = (int *)local_580;
    local_4c0.geometryUserPtr = pGVar11->userPtr;
    local_4c0.context = context->user;
    local_4c0.ray = (RTCRayN *)ray;
    local_4c0.hit = local_180;
    local_4c0.N = 8;
    if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar11->occlusionFilterN)(&local_4c0);
    }
    auVar79 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
    auVar220 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
    auVar162._16_16_ = auVar220;
    auVar162._0_16_ = auVar79;
    auVar90 = _DAT_01f7b020 & ~auVar162;
    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar90 >> 0x7f,0) != '\0') ||
          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar90 >> 0xbf,0) != '\0') ||
        (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar90[0x1f] < '\0')
    {
      p_Var14 = context->args->filter;
      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var14)(&local_4c0);
      }
      auVar79 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
      auVar220 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
      auVar99._16_16_ = auVar220;
      auVar99._0_16_ = auVar79;
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      auVar133._16_4_ = 0xff800000;
      auVar133._20_4_ = 0xff800000;
      auVar133._24_4_ = 0xff800000;
      auVar133._28_4_ = 0xff800000;
      auVar90 = vblendvps_avx(auVar133,*(undefined1 (*) [32])(local_4c0.ray + 0x100),auVar99);
      *(undefined1 (*) [32])(local_4c0.ray + 0x100) = auVar90;
      auVar90 = _DAT_01f7b020 & ~auVar99;
      if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar90 >> 0x7f,0) != '\0') ||
            (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar90 >> 0xbf,0) != '\0') ||
          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar90[0x1f] < '\0') {
        bVar64 = 1;
        goto LAB_009fc5bc;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar247;
  }
  bVar64 = 0;
LAB_009fc5bc:
  bVar63 = (bool)(bVar63 | bVar64);
  goto LAB_009fb5e0;
LAB_009fc5e8:
  auVar79 = vinsertps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar192),0x10);
  auVar334 = ZEXT1664(auVar79);
  auVar326 = ZEXT1664(auVar332);
  goto LAB_009faf7a;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }